

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_popcnt(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long lVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  int i_2;
  long lVar123;
  int i;
  long lVar124;
  ulong uVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  __m256i masks [16];
  uint32_t out_counters [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_240 [64];
  undefined1 local_200 [32];
  
  lVar123 = 0;
  lVar124 = 0;
  while (lVar124 != 0x10) {
    *(undefined8 *)(local_840 + lVar123) = 0;
    *(undefined8 *)(local_840 + lVar123 + 8) = 0;
    *(undefined8 *)(local_840 + lVar123 + 0x10) = 0;
    *(undefined8 *)(local_840 + lVar123 + 0x18) = 0;
    lVar124 = lVar124 + 1;
    auVar127 = vpbroadcastw_avx512vl();
    *(undefined1 (*) [32])((long)&local_5c0 + lVar123) = auVar127;
    lVar123 = lVar123 + 0x20;
  }
  lVar123 = 0;
  uVar125 = 0;
  local_240 = ZEXT464(0) << 0x40;
  auVar127._8_4_ = 0xfffefffe;
  auVar127._0_8_ = 0xfffefffefffefffe;
  auVar127._12_4_ = 0xfffefffe;
  auVar127._16_4_ = 0xfffefffe;
  auVar127._20_4_ = 0xfffefffe;
  auVar127._24_4_ = 0xfffefffe;
  auVar127._28_4_ = 0xfffefffe;
  auVar127 = vandpd_avx512vl(local_5a0,auVar127);
  local_640 = local_480;
  auVar128._8_4_ = 0xfffcfffc;
  auVar128._0_8_ = 0xfffcfffcfffcfffc;
  auVar128._12_4_ = 0xfffcfffc;
  auVar128._16_4_ = 0xfffcfffc;
  auVar128._20_4_ = 0xfffcfffc;
  auVar128._24_4_ = 0xfffcfffc;
  auVar128._28_4_ = 0xfffcfffc;
  auVar128 = vandpd_avx512vl(local_580,auVar128);
  auVar129._8_4_ = 0xffc0ffc0;
  auVar129._0_8_ = 0xffc0ffc0ffc0ffc0;
  auVar129._12_4_ = 0xffc0ffc0;
  auVar129._16_4_ = 0xffc0ffc0;
  auVar129._20_4_ = 0xffc0ffc0;
  auVar129._24_4_ = 0xffc0ffc0;
  auVar129._28_4_ = 0xffc0ffc0;
  auVar129 = vpandq_avx512vl(local_500,auVar129);
  auVar130._8_4_ = 0xfff0fff0;
  auVar130._0_8_ = 0xfff0fff0fff0fff0;
  auVar130._12_4_ = 0xfff0fff0;
  auVar130._16_4_ = 0xfff0fff0;
  auVar130._20_4_ = 0xfff0fff0;
  auVar130._24_4_ = 0xfff0fff0;
  auVar130._28_4_ = 0xfff0fff0;
  auVar130 = vpandq_avx512vl(local_540,auVar130);
  auVar131._8_4_ = 0xfff8fff8;
  auVar131._0_8_ = 0xfff8fff8fff8fff8;
  auVar131._12_4_ = 0xfff8fff8;
  auVar131._16_4_ = 0xfff8fff8;
  auVar131._20_4_ = 0xfff8fff8;
  auVar131._24_4_ = 0xfff8fff8;
  auVar131._28_4_ = 0xfff8fff8;
  auVar131 = vpandq_avx512vl(local_560,auVar131);
  auVar132._8_4_ = 0xfe00fe00;
  auVar132._0_8_ = 0xfe00fe00fe00fe00;
  auVar132._12_4_ = 0xfe00fe00;
  auVar132._16_4_ = 0xfe00fe00;
  auVar132._20_4_ = 0xfe00fe00;
  auVar132._24_4_ = 0xfe00fe00;
  auVar132._28_4_ = 0xfe00fe00;
  auVar132 = vpandq_avx512vl(local_4a0,auVar132);
  auVar133._8_4_ = 0xffe0ffe0;
  auVar133._0_8_ = 0xffe0ffe0ffe0ffe0;
  auVar133._12_4_ = 0xffe0ffe0;
  auVar133._16_4_ = 0xffe0ffe0;
  auVar133._20_4_ = 0xffe0ffe0;
  auVar133._24_4_ = 0xffe0ffe0;
  auVar133._28_4_ = 0xffe0ffe0;
  auVar133 = vpandq_avx512vl(local_520,auVar133);
  auVar134._8_4_ = 0xff00ff00;
  auVar134._0_8_ = 0xff00ff00ff00ff00;
  auVar134._12_4_ = 0xff00ff00;
  auVar134._16_4_ = 0xff00ff00;
  auVar134._20_4_ = 0xff00ff00;
  auVar134._24_4_ = 0xff00ff00;
  auVar134._28_4_ = 0xff00ff00;
  auVar134 = vpandd_avx512vl(local_4c0,auVar134);
  auVar182._8_4_ = 0xfc00fc00;
  auVar182._0_8_ = 0xfc00fc00fc00fc00;
  auVar182._12_4_ = 0xfc00fc00;
  auVar182._16_4_ = 0xfc00fc00;
  auVar182._20_4_ = 0xfc00fc00;
  auVar182._24_4_ = 0xfc00fc00;
  auVar182._28_4_ = 0xfc00fc00;
  local_200 = vpandq_avx512vl(local_480,auVar182);
  for (; uVar125 != len >> 8; uVar125 = uVar125 + 1) {
    auVar135 = vmovdqa64_avx512vl(local_5a0);
    auVar136 = vmovdqa64_avx512vl(local_540);
    auVar137 = vmovdqa64_avx512vl(local_500);
    auVar120._8_8_ = uStack_4d8;
    auVar120._0_8_ = local_4e0;
    auVar120._16_8_ = uStack_4d0;
    auVar120._24_8_ = uStack_4c8;
    auVar138 = vmovdqa64_avx512vl(local_4c0);
    auVar139 = vmovdqa64_avx512vl(local_4a0);
    auVar140 = vmovdqa64_avx512vl(local_640);
    auVar103._8_8_ = uStack_458;
    auVar103._0_8_ = local_460;
    auVar103._16_8_ = uStack_450;
    auVar103._24_8_ = uStack_448;
    auVar117._8_8_ = uStack_418;
    auVar117._0_8_ = local_420;
    auVar117._16_8_ = uStack_410;
    auVar117._24_8_ = uStack_408;
    auVar141 = vmovdqa64_avx512vl(auVar117);
    auVar114._8_8_ = uStack_3f8;
    auVar114._0_8_ = local_400;
    auVar114._16_8_ = uStack_3f0;
    auVar114._24_8_ = uStack_3e8;
    auVar107._8_8_ = uStack_5b8;
    auVar107._0_8_ = local_5c0;
    auVar107._16_8_ = uStack_5b0;
    auVar107._24_8_ = uStack_5a8;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10);
    auVar142 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x10));
    auVar143 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x20));
    auVar144 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x30));
    auVar145 = vpandq_avx512vl(auVar135,auVar182);
    auVar146 = vpandq_avx512vl(auVar142,auVar137);
    auVar147 = vpandq_avx512vl(auVar143,auVar137);
    auVar157 = vpand_avx2(auVar107,auVar182);
    auVar162 = vpsrlw_avx2(auVar145,1);
    auVar145 = vpand_avx2(auVar182,local_580);
    auVar148 = vpsrlw_avx512vl(auVar146,5);
    auVar149 = vpsrlw_avx512vl(auVar147,4);
    auVar146._8_4_ = 0x7fe07fe;
    auVar146._0_8_ = 0x7fe07fe07fe07fe;
    auVar146._12_4_ = 0x7fe07fe;
    auVar146._16_4_ = 0x7fe07fe;
    auVar146._20_4_ = 0x7fe07fe;
    auVar146._24_4_ = 0x7fe07fe;
    auVar146._28_4_ = 0x7fe07fe;
    auVar150 = vpandq_avx512vl(auVar148,auVar146);
    auVar147._8_4_ = 0xffc0ffc;
    auVar147._0_8_ = 0xffc0ffc0ffc0ffc;
    auVar147._12_4_ = 0xffc0ffc;
    auVar147._16_4_ = 0xffc0ffc;
    auVar147._20_4_ = 0xffc0ffc;
    auVar147._24_4_ = 0xffc0ffc;
    auVar147._28_4_ = 0xffc0ffc;
    auVar151 = vpandq_avx512vl(auVar149,auVar147);
    auVar163 = vpsrlw_avx2(auVar145,2);
    auVar145 = vpand_avx2(auVar182,local_560);
    auVar164 = vpsrlw_avx2(auVar145,3);
    auVar145 = vpandq_avx512vl(auVar136,auVar182);
    auVar165 = vpsrlw_avx2(auVar145,4);
    auVar145 = vpandq_avx512vl(auVar137,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,6);
    auVar152 = vporq_avx512vl(auVar145,local_780);
    auVar145 = vpand_avx2(auVar120,auVar182);
    auVar99._8_8_ = uStack_438;
    auVar99._0_8_ = local_440;
    auVar99._16_8_ = uStack_430;
    auVar99._24_8_ = uStack_428;
    auVar145 = vpsrlw_avx2(auVar145,7);
    auVar146 = vpor_avx2(auVar145,local_760);
    auVar145 = vpandq_avx512vl(auVar138,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,8);
    auVar147 = vpor_avx2(auVar145,local_740);
    auVar145 = vpandq_avx512vl(auVar139,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,9);
    auVar148 = vpor_avx2(auVar145,local_720);
    auVar145 = vpandq_avx512vl(auVar140,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,10);
    auVar149 = vpor_avx2(auVar145,local_700);
    auVar145 = vpand_avx2(auVar103,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,0xb);
    auVar156 = vpor_avx2(auVar145,local_6e0);
    auVar153 = vpternlogq_avx512vl(auVar151,auVar150,auVar152,0xfe);
    auVar150 = vpandq_avx512vl(auVar142,auVar120);
    auVar151 = vpandq_avx512vl(auVar143,auVar120);
    auVar145 = vpand_avx2(auVar182,auVar99);
    auVar152 = vpsrlw_avx512vl(auVar150,6);
    auVar154 = vpsrlw_avx512vl(auVar151,5);
    auVar150._8_4_ = 0x3fe03fe;
    auVar150._0_8_ = 0x3fe03fe03fe03fe;
    auVar150._12_4_ = 0x3fe03fe;
    auVar150._16_4_ = 0x3fe03fe;
    auVar150._20_4_ = 0x3fe03fe;
    auVar150._24_4_ = 0x3fe03fe;
    auVar150._28_4_ = 0x3fe03fe;
    auVar155 = vpandq_avx512vl(auVar152,auVar150);
    auVar151._8_4_ = 0x7fc07fc;
    auVar151._0_8_ = 0x7fc07fc07fc07fc;
    auVar151._12_4_ = 0x7fc07fc;
    auVar151._16_4_ = 0x7fc07fc;
    auVar151._20_4_ = 0x7fc07fc;
    auVar151._24_4_ = 0x7fc07fc;
    auVar151._28_4_ = 0x7fc07fc;
    auVar154 = vpandq_avx512vl(auVar154,auVar151);
    auVar145 = vpsrlw_avx2(auVar145,0xc);
    auVar150 = vpor_avx2(auVar145,local_6c0);
    auVar145 = vpandq_avx512vl(auVar141,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,0xd);
    auVar151 = vpor_avx2(auVar145,local_6a0);
    auVar145 = vpand_avx2(auVar114,auVar182);
    auVar145 = vpsrlw_avx2(auVar145,0xe);
    auVar152 = vpor_avx2(auVar145,local_680);
    auVar146 = vpternlogq_avx512vl(auVar154,auVar155,auVar146,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar138);
    auVar154 = vpandq_avx512vl(auVar143,auVar138);
    auVar187 = vpsrlw_avx2(auVar145,7);
    auVar155 = vpsrlw_avx512vl(auVar154,6);
    auVar145._8_4_ = 0x1fe01fe;
    auVar145._0_8_ = 0x1fe01fe01fe01fe;
    auVar145._12_4_ = 0x1fe01fe;
    auVar145._16_4_ = 0x1fe01fe;
    auVar145._20_4_ = 0x1fe01fe;
    auVar145._24_4_ = 0x1fe01fe;
    auVar145._28_4_ = 0x1fe01fe;
    auVar145 = vpandq_avx512vl(auVar187,auVar145);
    auVar154._8_4_ = 0x3fc03fc;
    auVar154._0_8_ = 0x3fc03fc03fc03fc;
    auVar154._12_4_ = 0x3fc03fc;
    auVar154._16_4_ = 0x3fc03fc;
    auVar154._20_4_ = 0x3fc03fc;
    auVar154._24_4_ = 0x3fc03fc;
    auVar154._28_4_ = 0x3fc03fc;
    auVar154 = vpandq_avx512vl(auVar155,auVar154);
    auVar147 = vpternlogq_avx512vl(auVar154,auVar145,auVar147,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar139);
    auVar154 = vpandq_avx512vl(auVar143,auVar139);
    auVar187 = vpsrlw_avx2(auVar145,8);
    auVar145 = vpsrlw_avx2(auVar154,7);
    auVar139._8_4_ = 0x1fc01fc;
    auVar139._0_8_ = 0x1fc01fc01fc01fc;
    auVar139._12_4_ = 0x1fc01fc;
    auVar139._16_4_ = 0x1fc01fc;
    auVar139._20_4_ = 0x1fc01fc;
    auVar139._24_4_ = 0x1fc01fc;
    auVar139._28_4_ = 0x1fc01fc;
    auVar145 = vpandq_avx512vl(auVar145,auVar139);
    auVar155._8_4_ = 0xfe00fe;
    auVar155._0_8_ = 0xfe00fe00fe00fe;
    auVar155._12_4_ = 0xfe00fe;
    auVar155._16_4_ = 0xfe00fe;
    auVar155._20_4_ = 0xfe00fe;
    auVar155._24_4_ = 0xfe00fe;
    auVar155._28_4_ = 0xfe00fe;
    auVar154 = vpandq_avx512vl(auVar187,auVar155);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar154,auVar148,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar140);
    auVar148 = vpandq_avx512vl(auVar143,auVar140);
    auVar139 = vpsrlw_avx2(auVar145,9);
    auVar145 = vpsrlw_avx2(auVar148,8);
    auVar148._8_4_ = 0xfc00fc;
    auVar148._0_8_ = 0xfc00fc00fc00fc;
    auVar148._12_4_ = 0xfc00fc;
    auVar148._16_4_ = 0xfc00fc;
    auVar148._20_4_ = 0xfc00fc;
    auVar148._24_4_ = 0xfc00fc;
    auVar148._28_4_ = 0xfc00fc;
    auVar145 = vpandq_avx512vl(auVar145,auVar148);
    auVar140._8_4_ = 0x7e007e;
    auVar140._0_8_ = 0x7e007e007e007e;
    auVar140._12_4_ = 0x7e007e;
    auVar140._16_4_ = 0x7e007e;
    auVar140._20_4_ = 0x7e007e;
    auVar140._24_4_ = 0x7e007e;
    auVar140._28_4_ = 0x7e007e;
    auVar148 = vpandq_avx512vl(auVar139,auVar140);
    auVar148 = vpternlogq_avx512vl(auVar145,auVar148,auVar149,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar103);
    auVar149 = vpandq_avx512vl(auVar143,auVar103);
    auVar145 = vpsrlw_avx2(auVar145,10);
    auVar139 = vpsrlw_avx2(auVar149,9);
    auVar149._8_4_ = 0x3e003e;
    auVar149._0_8_ = 0x3e003e003e003e;
    auVar149._12_4_ = 0x3e003e;
    auVar149._16_4_ = 0x3e003e;
    auVar149._20_4_ = 0x3e003e;
    auVar149._24_4_ = 0x3e003e;
    auVar149._28_4_ = 0x3e003e;
    auVar145 = vpandq_avx512vl(auVar145,auVar149);
    auVar187._8_4_ = 0x7c007c;
    auVar187._0_8_ = 0x7c007c007c007c;
    auVar187._12_4_ = 0x7c007c;
    auVar187._16_4_ = 0x7c007c;
    auVar187._20_4_ = 0x7c007c;
    auVar187._24_4_ = 0x7c007c;
    auVar187._28_4_ = 0x7c007c;
    auVar149 = vpandq_avx512vl(auVar139,auVar187);
    auVar149 = vpternlogq_avx512vl(auVar149,auVar145,auVar156,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar99);
    auVar156 = vpandq_avx512vl(auVar143,auVar99);
    auVar111._8_8_ = uStack_3d8;
    auVar111._0_8_ = local_3e0;
    auVar111._16_8_ = uStack_3d0;
    auVar111._24_8_ = uStack_3c8;
    auVar139 = vpsrlw_avx2(auVar145,0xb);
    auVar145 = vpsrlw_avx2(auVar156,10);
    auVar156._8_4_ = 0x3c003c;
    auVar156._0_8_ = 0x3c003c003c003c;
    auVar156._12_4_ = 0x3c003c;
    auVar156._16_4_ = 0x3c003c;
    auVar156._20_4_ = 0x3c003c;
    auVar156._24_4_ = 0x3c003c;
    auVar156._28_4_ = 0x3c003c;
    auVar145 = vpandq_avx512vl(auVar145,auVar156);
    auVar158._8_4_ = 0x1e001e;
    auVar158._0_8_ = 0x1e001e001e001e;
    auVar158._12_4_ = 0x1e001e;
    auVar158._16_4_ = 0x1e001e;
    auVar158._20_4_ = 0x1e001e;
    auVar158._24_4_ = 0x1e001e;
    auVar158._28_4_ = 0x1e001e;
    auVar156 = vpandq_avx512vl(auVar139,auVar158);
    auVar156 = vpternlogq_avx512vl(auVar145,auVar156,auVar150,0xfe);
    auVar145 = vpandq_avx512vl(auVar142,auVar141);
    auVar150 = vpandq_avx512vl(auVar143,auVar141);
    auVar139 = vpsrlw_avx2(auVar145,0xc);
    auVar145 = vpsrlw_avx2(auVar150,0xb);
    auVar141._8_4_ = 0x1c001c;
    auVar141._0_8_ = 0x1c001c001c001c;
    auVar141._12_4_ = 0x1c001c;
    auVar141._16_4_ = 0x1c001c;
    auVar141._20_4_ = 0x1c001c;
    auVar141._24_4_ = 0x1c001c;
    auVar141._28_4_ = 0x1c001c;
    auVar145 = vpandq_avx512vl(auVar145,auVar141);
    auVar159._8_4_ = 0xe000e;
    auVar159._0_8_ = 0xe000e000e000e;
    auVar159._12_4_ = 0xe000e;
    auVar159._16_4_ = 0xe000e;
    auVar159._20_4_ = 0xe000e;
    auVar159._24_4_ = 0xe000e;
    auVar159._28_4_ = 0xe000e;
    auVar150 = vpandq_avx512vl(auVar139,auVar159);
    auVar139 = vpandq_avx512vl(auVar142,auVar127);
    auVar150 = vpternlogq_avx512vl(auVar145,auVar150,auVar151,0xfe);
    auVar145 = vpandq_avx512vl(auVar143,auVar114);
    auVar151 = vpandq_avx512vl(auVar142,auVar114);
    auVar145 = vpsrlw_avx2(auVar145,0xc);
    auVar160._8_4_ = 0xc000c;
    auVar160._0_8_ = 0xc000c000c000c;
    auVar160._12_4_ = 0xc000c;
    auVar160._16_4_ = 0xc000c;
    auVar160._20_4_ = 0xc000c;
    auVar160._24_4_ = 0xc000c;
    auVar160._28_4_ = 0xc000c;
    auVar155 = vpandq_avx512vl(auVar145,auVar160);
    auVar145 = vpandq_avx512vl(auVar142,auVar107);
    auVar151 = vpsrlw_avx2(auVar151,0xd);
    auVar161._8_4_ = 0x60006;
    auVar161._0_8_ = 0x6000600060006;
    auVar161._12_4_ = 0x60006;
    auVar161._16_4_ = 0x60006;
    auVar161._20_4_ = 0x60006;
    auVar161._24_4_ = 0x60006;
    auVar161._28_4_ = 0x60006;
    auVar151 = vpandq_avx512vl(auVar151,auVar161);
    auVar145 = vpaddw_avx2(auVar145,auVar145);
    auVar140 = vpternlogq_avx512vl(auVar145,auVar157,local_840,0xfe);
    auVar151 = vpternlogq_avx512vl(auVar155,auVar151,auVar152,0xfe);
    auVar145 = vpand_avx2(local_520,auVar182);
    auVar182 = vpand_avx2(auVar182,auVar111);
    auVar139 = vpternlogq_avx512vl(auVar139,auVar162,local_820,0xfe);
    auVar157 = vpandq_avx512vl(auVar142,local_580);
    auVar187 = vpsrlw_avx2(auVar145,5);
    auVar182 = vpsrlw_avx2(auVar182,0xf);
    auVar182 = vpor_avx2(auVar182,local_660);
    auVar145 = vpsrlw_avx2(auVar157,1);
    auVar157._8_4_ = 0x7ffe7ffe;
    auVar157._0_8_ = 0x7ffe7ffe7ffe7ffe;
    auVar157._12_4_ = 0x7ffe7ffe;
    auVar157._16_4_ = 0x7ffe7ffe;
    auVar157._20_4_ = 0x7ffe7ffe;
    auVar157._24_4_ = 0x7ffe7ffe;
    auVar157._28_4_ = 0x7ffe7ffe;
    auVar145 = vpandq_avx512vl(auVar145,auVar157);
    auVar183._8_8_ = 0xfff8fff8fff8fff8;
    auVar183._0_8_ = 0xfff8fff8fff8fff8;
    auVar183._16_8_ = 0xfff8fff8fff8fff8;
    auVar183._24_8_ = 0xfff8fff8fff8fff8;
    auVar145 = vpternlogq_avx512vl(auVar145,auVar163,local_800,0xfe);
    auVar157 = vpandq_avx512vl(auVar142,local_560);
    auVar157 = vpsrlw_avx2(auVar157,2);
    auVar152._8_4_ = 0x3ffe3ffe;
    auVar152._0_8_ = 0x3ffe3ffe3ffe3ffe;
    auVar152._12_4_ = 0x3ffe3ffe;
    auVar152._16_4_ = 0x3ffe3ffe;
    auVar152._20_4_ = 0x3ffe3ffe;
    auVar152._24_4_ = 0x3ffe3ffe;
    auVar152._28_4_ = 0x3ffe3ffe;
    auVar157 = vpandq_avx512vl(auVar157,auVar152);
    auVar157 = vpternlogq_avx512vl(auVar157,auVar164,local_7e0,0xfe);
    auVar152 = vpandq_avx512vl(auVar142,auVar136);
    auVar152 = vpsrlw_avx2(auVar152,3);
    auVar162._8_4_ = 0x1ffe1ffe;
    auVar162._0_8_ = 0x1ffe1ffe1ffe1ffe;
    auVar162._12_4_ = 0x1ffe1ffe;
    auVar162._16_4_ = 0x1ffe1ffe;
    auVar162._20_4_ = 0x1ffe1ffe;
    auVar162._24_4_ = 0x1ffe1ffe;
    auVar162._28_4_ = 0x1ffe1ffe;
    auVar152 = vpandq_avx512vl(auVar152,auVar162);
    auVar152 = vpternlogq_avx512vl(auVar152,auVar165,local_7c0,0xfe);
    auVar155 = vpandq_avx512vl(auVar142,local_520);
    auVar155 = vpsrlw_avx2(auVar155,4);
    auVar163._8_4_ = 0xffe0ffe;
    auVar163._0_8_ = 0xffe0ffe0ffe0ffe;
    auVar163._12_4_ = 0xffe0ffe;
    auVar163._16_4_ = 0xffe0ffe;
    auVar163._20_4_ = 0xffe0ffe;
    auVar163._24_4_ = 0xffe0ffe;
    auVar163._28_4_ = 0xffe0ffe;
    auVar155 = vpandq_avx512vl(auVar155,auVar163);
    auVar155 = vpternlogq_avx512vl(auVar155,auVar187,local_7a0,0xfe);
    auVar187 = vpandq_avx512vl(auVar142,auVar111);
    auVar187 = vpsrlw_avx2(auVar187,0xe);
    auVar142._8_4_ = 0x20002;
    auVar142._0_8_ = 0x2000200020002;
    auVar142._12_4_ = 0x20002;
    auVar142._16_4_ = 0x20002;
    auVar142._20_4_ = 0x20002;
    auVar142._24_4_ = 0x20002;
    auVar142._28_4_ = 0x20002;
    auVar187 = vpandq_avx512vl(auVar187,auVar142);
    auVar158 = vpandq_avx512vl(auVar143,auVar111);
    auVar158 = vpsrlw_avx2(auVar158,0xd);
    auVar164._8_4_ = 0x40004;
    auVar164._0_8_ = 0x4000400040004;
    auVar164._12_4_ = 0x40004;
    auVar164._16_4_ = 0x40004;
    auVar164._20_4_ = 0x40004;
    auVar164._24_4_ = 0x40004;
    auVar164._28_4_ = 0x40004;
    auVar158 = vpandq_avx512vl(auVar158,auVar164);
    auVar187 = vpternlogq_avx512vl(auVar158,auVar187,auVar182,0xfe);
    auVar182 = vpandq_avx512vl(auVar143,auVar107);
    auVar158 = vpsllw_avx2(auVar182,2);
    auVar182 = vpandq_avx512vl(auVar144,auVar107);
    auVar115._8_8_ = uStack_3f8;
    auVar115._0_8_ = local_400;
    auVar115._16_8_ = uStack_3f0;
    auVar115._24_8_ = uStack_3e8;
    auVar182 = vpsllw_avx2(auVar182,3);
    auVar140 = vpternlogq_avx512vl(auVar182,auVar140,auVar158,0xfe);
    auVar182 = vpandq_avx512vl(auVar143,auVar135);
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar165._8_4_ = 0xfffcfffc;
    auVar165._0_8_ = 0xfffcfffcfffcfffc;
    auVar165._12_4_ = 0xfffcfffc;
    auVar165._16_4_ = 0xfffcfffc;
    auVar165._20_4_ = 0xfffcfffc;
    auVar165._24_4_ = 0xfffcfffc;
    auVar165._28_4_ = 0xfffcfffc;
    auVar158 = vpandq_avx512vl(auVar182,auVar165);
    auVar182 = vpandq_avx512vl(auVar144,auVar135);
    auVar182 = vpsllw_avx2(auVar182,2);
    auVar182 = vpand_avx2(auVar182,auVar183);
    auVar139 = vpternlogq_avx512vl(auVar182,auVar158,auVar139,0xfe);
    auVar158 = vpandq_avx512vl(auVar143,auVar128);
    auVar182 = vpandq_avx512vl(auVar144,local_580);
    auVar141 = vpandq_avx512vl(auVar143,local_520);
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar141 = vpsrlw_avx2(auVar141,3);
    auVar135._8_4_ = 0x1ffc1ffc;
    auVar135._0_8_ = 0x1ffc1ffc1ffc1ffc;
    auVar135._12_4_ = 0x1ffc1ffc;
    auVar135._16_4_ = 0x1ffc1ffc;
    auVar135._20_4_ = 0x1ffc1ffc;
    auVar135._24_4_ = 0x1ffc1ffc;
    auVar135._28_4_ = 0x1ffc1ffc;
    auVar141 = vpandq_avx512vl(auVar141,auVar135);
    auVar182 = vpand_avx2(auVar182,auVar183);
    auVar159 = vpandq_avx512vl(auVar144,auVar131);
    auVar158 = vpternlogq_avx512vl(auVar182,auVar158,auVar145,0xfe);
    auVar182 = vpandq_avx512vl(auVar143,local_560);
    auVar145 = vpandq_avx512vl(auVar144,auVar136);
    auVar182 = vpsrlw_avx2(auVar182,1);
    auVar184._8_4_ = 0x7ffc7ffc;
    auVar184._0_8_ = 0x7ffc7ffc7ffc7ffc;
    auVar184._12_4_ = 0x7ffc7ffc;
    auVar184._16_4_ = 0x7ffc7ffc;
    auVar184._20_4_ = 0x7ffc7ffc;
    auVar184._24_4_ = 0x7ffc7ffc;
    auVar184._28_4_ = 0x7ffc7ffc;
    auVar182 = vpandq_avx512vl(auVar182,auVar184);
    auVar145 = vpsrlw_avx2(auVar145,1);
    auVar186._8_4_ = 0x7ff87ff8;
    auVar186._0_8_ = 0x7ff87ff87ff87ff8;
    auVar186._12_4_ = 0x7ff87ff8;
    auVar186._16_4_ = 0x7ff87ff8;
    auVar186._20_4_ = 0x7ff87ff8;
    auVar186._24_4_ = 0x7ff87ff8;
    auVar186._28_4_ = 0x7ff87ff8;
    auVar145 = vpandq_avx512vl(auVar145,auVar186);
    auVar159 = vpternlogq_avx512vl(auVar159,auVar182,auVar157,0xfe);
    auVar157 = vpandq_avx512vl(auVar143,auVar136);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x40);
    auVar100._8_8_ = uStack_438;
    auVar100._0_8_ = local_440;
    auVar100._16_8_ = uStack_430;
    auVar100._24_8_ = uStack_428;
    auVar160 = vmovdqa64_avx512vl(auVar100);
    auVar157 = vpsrlw_avx2(auVar157,2);
    auVar136._8_4_ = 0x3ffc3ffc;
    auVar136._0_8_ = 0x3ffc3ffc3ffc3ffc;
    auVar136._12_4_ = 0x3ffc3ffc;
    auVar136._16_4_ = 0x3ffc3ffc;
    auVar136._20_4_ = 0x3ffc3ffc;
    auVar136._24_4_ = 0x3ffc3ffc;
    auVar136._28_4_ = 0x3ffc3ffc;
    auVar157 = vpandq_avx512vl(auVar157,auVar136);
    auVar152 = vpternlogq_avx512vl(auVar145,auVar157,auVar152,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,local_520);
    auVar145 = vpsrlw_avx2(auVar145,2);
    auVar143._8_4_ = 0x3ff83ff8;
    auVar143._0_8_ = 0x3ff83ff83ff83ff8;
    auVar143._12_4_ = 0x3ff83ff8;
    auVar143._16_4_ = 0x3ff83ff8;
    auVar143._20_4_ = 0x3ff83ff8;
    auVar143._24_4_ = 0x3ff83ff8;
    auVar143._28_4_ = 0x3ff83ff8;
    auVar145 = vpandq_avx512vl(auVar145,auVar143);
    auVar155 = vpternlogq_avx512vl(auVar145,auVar141,auVar155,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar137);
    auVar112._8_8_ = uStack_3d8;
    auVar112._0_8_ = local_3e0;
    auVar112._16_8_ = uStack_3d0;
    auVar112._24_8_ = uStack_3c8;
    auVar145 = vpsrlw_avx2(auVar145,3);
    auVar3._8_4_ = 0x1ff81ff8;
    auVar3._0_8_ = 0x1ff81ff81ff81ff8;
    auVar3._12_4_ = 0x1ff81ff8;
    auVar3._16_4_ = 0x1ff81ff8;
    auVar3._20_4_ = 0x1ff81ff8;
    auVar3._24_4_ = 0x1ff81ff8;
    auVar3._28_4_ = 0x1ff81ff8;
    auVar145 = vpandq_avx512vl(auVar145,auVar3);
    auVar157 = vpandq_avx512vl(auVar182,auVar137);
    auVar157 = vpsrlw_avx2(auVar157,2);
    auVar4._8_4_ = 0x3ff03ff0;
    auVar4._0_8_ = 0x3ff03ff03ff03ff0;
    auVar4._12_4_ = 0x3ff03ff0;
    auVar4._16_4_ = 0x3ff03ff0;
    auVar4._20_4_ = 0x3ff03ff0;
    auVar4._24_4_ = 0x3ff03ff0;
    auVar4._28_4_ = 0x3ff03ff0;
    auVar157 = vpandq_avx512vl(auVar157,auVar4);
    auVar141 = vpternlogq_avx512vl(auVar157,auVar145,auVar153,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar120);
    auVar145 = vpsrlw_avx2(auVar145,4);
    auVar153._8_4_ = 0xff80ff8;
    auVar153._0_8_ = 0xff80ff80ff80ff8;
    auVar153._12_4_ = 0xff80ff8;
    auVar153._16_4_ = 0xff80ff8;
    auVar153._20_4_ = 0xff80ff8;
    auVar153._24_4_ = 0xff80ff8;
    auVar153._28_4_ = 0xff80ff8;
    auVar157 = vpandq_avx512vl(auVar145,auVar153);
    auVar145 = vpand_avx2(auVar182,auVar120);
    auVar161 = vmovdqa64_avx512vl(auVar160);
    auVar145 = vpsrlw_avx2(auVar145,3);
    auVar5._8_4_ = 0x1ff01ff0;
    auVar5._0_8_ = 0x1ff01ff01ff01ff0;
    auVar5._12_4_ = 0x1ff01ff0;
    auVar5._16_4_ = 0x1ff01ff0;
    auVar5._20_4_ = 0x1ff01ff0;
    auVar5._24_4_ = 0x1ff01ff0;
    auVar5._28_4_ = 0x1ff01ff0;
    auVar145 = vpandq_avx512vl(auVar145,auVar5);
    auVar162 = vpternlogq_avx512vl(auVar145,auVar157,auVar146,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar138);
    auVar145 = vpsrlw_avx2(auVar145,5);
    auVar6._8_4_ = 0x7f807f8;
    auVar6._0_8_ = 0x7f807f807f807f8;
    auVar6._12_4_ = 0x7f807f8;
    auVar6._16_4_ = 0x7f807f8;
    auVar6._20_4_ = 0x7f807f8;
    auVar6._24_4_ = 0x7f807f8;
    auVar6._28_4_ = 0x7f807f8;
    auVar145 = vpandq_avx512vl(auVar145,auVar6);
    auVar157 = vpandq_avx512vl(auVar182,auVar138);
    auVar163 = vmovdqa64_avx512vl(local_4c0);
    auVar157 = vpsrlw_avx2(auVar157,4);
    auVar138._8_4_ = 0xff00ff0;
    auVar138._0_8_ = 0xff00ff00ff00ff0;
    auVar138._12_4_ = 0xff00ff0;
    auVar138._16_4_ = 0xff00ff0;
    auVar138._20_4_ = 0xff00ff0;
    auVar138._24_4_ = 0xff00ff0;
    auVar138._28_4_ = 0xff00ff0;
    auVar157 = vpandq_avx512vl(auVar157,auVar138);
    auVar147 = vpternlogq_avx512vl(auVar157,auVar145,auVar147,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,local_4a0);
    auVar157 = vpandq_avx512vl(auVar182,local_4a0);
    auVar146 = vpsrlw_avx2(auVar145,6);
    auVar145 = vpsrlw_avx512vl(auVar157,5);
    auVar7._8_4_ = 0x7f007f0;
    auVar7._0_8_ = 0x7f007f007f007f0;
    auVar7._12_4_ = 0x7f007f0;
    auVar7._16_4_ = 0x7f007f0;
    auVar7._20_4_ = 0x7f007f0;
    auVar7._24_4_ = 0x7f007f0;
    auVar7._28_4_ = 0x7f007f0;
    auVar145 = vpandq_avx512vl(auVar145,auVar7);
    auVar8._8_4_ = 0x3f803f8;
    auVar8._0_8_ = 0x3f803f803f803f8;
    auVar8._12_4_ = 0x3f803f8;
    auVar8._16_4_ = 0x3f803f8;
    auVar8._20_4_ = 0x3f803f8;
    auVar8._24_4_ = 0x3f803f8;
    auVar8._28_4_ = 0x3f803f8;
    auVar157 = vpandq_avx512vl(auVar146,auVar8);
    auVar146 = vpandq_avx512vl(auVar182,local_640);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar157,auVar154,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,local_640);
    auVar157 = vpsrlw_avx512vl(auVar146,6);
    auVar9._8_4_ = 0x3f003f0;
    auVar9._0_8_ = 0x3f003f003f003f0;
    auVar9._12_4_ = 0x3f003f0;
    auVar9._16_4_ = 0x3f003f0;
    auVar9._20_4_ = 0x3f003f0;
    auVar9._24_4_ = 0x3f003f0;
    auVar9._28_4_ = 0x3f003f0;
    auVar157 = vpandq_avx512vl(auVar157,auVar9);
    auVar104._8_8_ = uStack_458;
    auVar104._0_8_ = local_460;
    auVar104._16_8_ = uStack_450;
    auVar104._24_8_ = uStack_448;
    auVar146 = vpandq_avx512vl(auVar182,auVar115);
    auVar145 = vpsrlw_avx2(auVar145,7);
    auVar10._8_4_ = 0x1f801f8;
    auVar10._0_8_ = 0x1f801f801f801f8;
    auVar10._12_4_ = 0x1f801f8;
    auVar10._16_4_ = 0x1f801f8;
    auVar10._20_4_ = 0x1f801f8;
    auVar10._24_4_ = 0x1f801f8;
    auVar10._28_4_ = 0x1f801f8;
    auVar145 = vpandq_avx512vl(auVar145,auVar10);
    auVar146 = vpsrlw_avx512vl(auVar146,10);
    auVar142 = vpandq_avx512vl(auVar182,auVar104);
    auVar148 = vpternlogq_avx512vl(auVar157,auVar145,auVar148,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar104);
    auVar157 = vpsrlw_avx512vl(auVar142,7);
    auVar11._8_4_ = 0x1f001f0;
    auVar11._0_8_ = 0x1f001f001f001f0;
    auVar11._12_4_ = 0x1f001f0;
    auVar11._16_4_ = 0x1f001f0;
    auVar11._20_4_ = 0x1f001f0;
    auVar11._24_4_ = 0x1f001f0;
    auVar11._28_4_ = 0x1f001f0;
    auVar157 = vpandq_avx512vl(auVar157,auVar11);
    auVar142 = vpandq_avx512vl(auVar182,auVar160);
    auVar118._8_8_ = uStack_418;
    auVar118._0_8_ = local_420;
    auVar118._16_8_ = uStack_410;
    auVar118._24_8_ = uStack_408;
    auVar164 = vpbroadcastq_avx512vl(ZEXT816(0xffe0ffe0ffe0ffe0));
    auVar145 = vpsrlw_avx2(auVar145,8);
    auVar12._8_4_ = 0xf800f8;
    auVar12._0_8_ = 0xf800f800f800f8;
    auVar12._12_4_ = 0xf800f8;
    auVar12._16_4_ = 0xf800f8;
    auVar12._20_4_ = 0xf800f8;
    auVar12._24_4_ = 0xf800f8;
    auVar12._28_4_ = 0xf800f8;
    auVar145 = vpandq_avx512vl(auVar145,auVar12);
    auVar142 = vpsrlw_avx512vl(auVar142,8);
    auVar13._8_4_ = 0xf000f0;
    auVar13._0_8_ = 0xf000f000f000f0;
    auVar13._12_4_ = 0xf000f0;
    auVar13._16_4_ = 0xf000f0;
    auVar13._20_4_ = 0xf000f0;
    auVar13._24_4_ = 0xf000f0;
    auVar13._28_4_ = 0xf000f0;
    auVar142 = vpandq_avx512vl(auVar142,auVar13);
    auVar165 = vpandq_avx512vl(auVar182,auVar118);
    auVar135 = vmovdqa64_avx512vl(auVar118);
    auVar149 = vpternlogq_avx512vl(auVar157,auVar145,auVar149,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar160);
    auVar157 = vpsrlw_avx512vl(auVar165,9);
    auVar108._8_8_ = uStack_5b8;
    auVar108._0_8_ = local_5c0;
    auVar108._16_8_ = uStack_5b0;
    auVar108._24_8_ = uStack_5a8;
    auVar160 = vmovdqa64_avx512vl(auVar108);
    auVar145 = vpsrlw_avx2(auVar145,9);
    auVar14._8_4_ = 0x780078;
    auVar14._0_8_ = 0x78007800780078;
    auVar14._12_4_ = 0x780078;
    auVar14._16_4_ = 0x780078;
    auVar14._20_4_ = 0x780078;
    auVar14._24_4_ = 0x780078;
    auVar14._28_4_ = 0x780078;
    auVar145 = vpandq_avx512vl(auVar145,auVar14);
    auVar156 = vpternlogq_avx512vl(auVar142,auVar145,auVar156,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar118);
    auVar15._8_4_ = 0x700070;
    auVar15._0_8_ = 0x70007000700070;
    auVar15._12_4_ = 0x700070;
    auVar15._16_4_ = 0x700070;
    auVar15._20_4_ = 0x700070;
    auVar15._24_4_ = 0x700070;
    auVar15._28_4_ = 0x700070;
    auVar157 = vpandq_avx512vl(auVar157,auVar15);
    auVar142 = vpandq_avx512vl(auVar144,auVar112);
    auVar145 = vpsrlw_avx2(auVar145,10);
    auVar16._8_4_ = 0x380038;
    auVar16._0_8_ = 0x38003800380038;
    auVar16._12_4_ = 0x380038;
    auVar16._16_4_ = 0x380038;
    auVar16._20_4_ = 0x380038;
    auVar16._24_4_ = 0x380038;
    auVar16._28_4_ = 0x380038;
    auVar145 = vpandq_avx512vl(auVar145,auVar16);
    auVar142 = vpsrlw_avx512vl(auVar142,0xc);
    auVar17._8_4_ = 0x80008;
    auVar17._0_8_ = 0x8000800080008;
    auVar17._12_4_ = 0x80008;
    auVar17._16_4_ = 0x80008;
    auVar17._20_4_ = 0x80008;
    auVar17._24_4_ = 0x80008;
    auVar17._28_4_ = 0x80008;
    auVar142 = vpandq_avx512vl(auVar142,auVar17);
    auVar150 = vpternlogq_avx512vl(auVar157,auVar145,auVar150,0xfe);
    auVar145 = vpandq_avx512vl(auVar144,auVar115);
    auVar144._8_4_ = 0x300030;
    auVar144._0_8_ = 0x30003000300030;
    auVar144._12_4_ = 0x300030;
    auVar144._16_4_ = 0x300030;
    auVar144._20_4_ = 0x300030;
    auVar144._24_4_ = 0x300030;
    auVar144._28_4_ = 0x300030;
    auVar157 = vpandq_avx512vl(auVar146,auVar144);
    auVar145 = vpsrlw_avx2(auVar145,0xb);
    auVar18._8_4_ = 0x180018;
    auVar18._0_8_ = 0x18001800180018;
    auVar18._12_4_ = 0x180018;
    auVar18._16_4_ = 0x180018;
    auVar18._20_4_ = 0x180018;
    auVar18._24_4_ = 0x180018;
    auVar18._28_4_ = 0x180018;
    auVar145 = vpandq_avx512vl(auVar145,auVar18);
    auVar151 = vpternlogq_avx512vl(auVar157,auVar145,auVar151,0xfe);
    auVar145 = vpandq_avx512vl(auVar182,auVar160);
    auVar157 = vpsllw_avx512vl(auVar145,4);
    auVar145 = vpand_avx2(auVar182,auVar112);
    auVar145 = vpsrlw_avx2(auVar145,0xb);
    auVar19._8_4_ = 0x100010;
    auVar19._0_8_ = 0x10001000100010;
    auVar19._12_4_ = 0x100010;
    auVar19._16_4_ = 0x100010;
    auVar19._20_4_ = 0x100010;
    auVar19._24_4_ = 0x100010;
    auVar19._28_4_ = 0x100010;
    auVar146 = vpandq_avx512vl(auVar145,auVar19);
    auVar145 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x50);
    auVar187 = vpternlogq_avx512vl(auVar146,auVar142,auVar187,0xfe);
    auVar146 = vpandq_avx512vl(auVar145,auVar160);
    auVar146 = vpsllw_avx2(auVar146,5);
    auVar140 = vpternlogq_avx512vl(auVar146,auVar140,auVar157,0xfe);
    auVar146 = vpbroadcastq_avx512vl(ZEXT816(0xfff0fff0fff0fff0));
    auVar157 = vpand_avx2(auVar182,local_5a0);
    auVar157 = vpsllw_avx2(auVar157,3);
    auVar142 = vpandq_avx512vl(auVar157,auVar146);
    auVar157 = vpand_avx2(auVar145,local_5a0);
    auVar157 = vpsllw_avx2(auVar157,4);
    auVar157 = vpandq_avx512vl(auVar157,auVar164);
    auVar139 = vpternlogq_avx512vl(auVar157,auVar142,auVar139,0xfe);
    auVar157 = vpand_avx2(auVar182,local_580);
    auVar157 = vpsllw_avx2(auVar157,2);
    auVar142 = vpandq_avx512vl(auVar157,auVar146);
    auVar157 = vpand_avx2(auVar145,local_580);
    auVar157 = vpsllw_avx2(auVar157,3);
    auVar157 = vpandq_avx512vl(auVar157,auVar164);
    auVar158 = vpternlogq_avx512vl(auVar157,auVar142,auVar158,0xfe);
    auVar157 = vpand_avx2(auVar182,local_560);
    auVar142 = vpandq_avx512vl(auVar145,local_560);
    auVar121._8_8_ = uStack_4d8;
    auVar121._0_8_ = local_4e0;
    auVar121._16_8_ = uStack_4d0;
    auVar121._24_8_ = uStack_4c8;
    auVar157 = vpaddw_avx2(auVar157,auVar157);
    auVar142 = vpsllw_avx512vl(auVar142,2);
    auVar157 = vpandq_avx512vl(auVar157,auVar146);
    auVar146 = vpandq_avx512vl(auVar142,auVar164);
    auVar159 = vpternlogq_avx512vl(auVar146,auVar157,auVar159,0xfe);
    auVar157 = vpand_avx2(auVar182,local_520);
    auVar146 = vpand_avx2(auVar182,auVar130);
    auVar182 = vpsrlw_avx2(auVar157,1);
    auVar20._8_4_ = 0x7ff07ff0;
    auVar20._0_8_ = 0x7ff07ff07ff07ff0;
    auVar20._12_4_ = 0x7ff07ff0;
    auVar20._16_4_ = 0x7ff07ff0;
    auVar20._20_4_ = 0x7ff07ff0;
    auVar20._24_4_ = 0x7ff07ff0;
    auVar20._28_4_ = 0x7ff07ff0;
    auVar157 = vpandq_avx512vl(auVar182,auVar20);
    auVar182 = vpand_avx2(auVar145,local_540);
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar142 = vpandq_avx512vl(auVar182,auVar164);
    auVar182 = vpand_avx2(auVar145,auVar133);
    auVar152 = vpternlogq_avx512vl(auVar142,auVar146,auVar152,0xfe);
    auVar155 = vpternlogq_avx512vl(auVar182,auVar157,auVar155,0xfe);
    auVar182 = vpandq_avx512vl(auVar145,auVar137);
    auVar182 = vpsrlw_avx2(auVar182,1);
    auVar137._8_4_ = 0x7fe07fe0;
    auVar137._0_8_ = 0x7fe07fe07fe07fe0;
    auVar137._12_4_ = 0x7fe07fe0;
    auVar137._16_4_ = 0x7fe07fe0;
    auVar137._20_4_ = 0x7fe07fe0;
    auVar137._24_4_ = 0x7fe07fe0;
    auVar137._28_4_ = 0x7fe07fe0;
    auVar146 = vpandq_avx512vl(auVar182,auVar137);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x60);
    auVar157 = vpand_avx2(auVar182,auVar129);
    auVar141 = vpternlogq_avx512vl(auVar157,auVar146,auVar141,0xfe);
    auVar157 = vpand_avx2(auVar145,auVar121);
    auVar146 = vpand_avx2(auVar182,auVar121);
    auVar157 = vpsrlw_avx2(auVar157,2);
    auVar146 = vpsrlw_avx2(auVar146,1);
    auVar21._8_4_ = 0x3fe03fe0;
    auVar21._0_8_ = 0x3fe03fe03fe03fe0;
    auVar21._12_4_ = 0x3fe03fe0;
    auVar21._16_4_ = 0x3fe03fe0;
    auVar21._20_4_ = 0x3fe03fe0;
    auVar21._24_4_ = 0x3fe03fe0;
    auVar21._28_4_ = 0x3fe03fe0;
    auVar157 = vpandq_avx512vl(auVar157,auVar21);
    auVar22._8_4_ = 0x7fc07fc0;
    auVar22._0_8_ = 0x7fc07fc07fc07fc0;
    auVar22._12_4_ = 0x7fc07fc0;
    auVar22._16_4_ = 0x7fc07fc0;
    auVar22._20_4_ = 0x7fc07fc0;
    auVar22._24_4_ = 0x7fc07fc0;
    auVar22._28_4_ = 0x7fc07fc0;
    auVar146 = vpandq_avx512vl(auVar146,auVar22);
    auVar162 = vpternlogq_avx512vl(auVar146,auVar157,auVar162,0xfe);
    auVar157 = vpandq_avx512vl(auVar145,auVar163);
    auVar146 = vpandq_avx512vl(auVar182,auVar163);
    auVar157 = vpsrlw_avx2(auVar157,3);
    auVar146 = vpsrlw_avx2(auVar146,2);
    auVar23._8_4_ = 0x3fc03fc0;
    auVar23._0_8_ = 0x3fc03fc03fc03fc0;
    auVar23._12_4_ = 0x3fc03fc0;
    auVar23._16_4_ = 0x3fc03fc0;
    auVar23._20_4_ = 0x3fc03fc0;
    auVar23._24_4_ = 0x3fc03fc0;
    auVar23._28_4_ = 0x3fc03fc0;
    auVar146 = vpandq_avx512vl(auVar146,auVar23);
    auVar24._8_4_ = 0x1fe01fe0;
    auVar24._0_8_ = 0x1fe01fe01fe01fe0;
    auVar24._12_4_ = 0x1fe01fe0;
    auVar24._16_4_ = 0x1fe01fe0;
    auVar24._20_4_ = 0x1fe01fe0;
    auVar24._24_4_ = 0x1fe01fe0;
    auVar24._28_4_ = 0x1fe01fe0;
    auVar142 = vpandq_avx512vl(auVar157,auVar24);
    auVar157 = vpand_avx2(auVar182,local_4a0);
    auVar157 = vpsrlw_avx2(auVar157,3);
    auVar25._8_4_ = 0x1fc01fc0;
    auVar25._0_8_ = 0x1fc01fc01fc01fc0;
    auVar25._12_4_ = 0x1fc01fc0;
    auVar25._16_4_ = 0x1fc01fc0;
    auVar25._20_4_ = 0x1fc01fc0;
    auVar25._24_4_ = 0x1fc01fc0;
    auVar25._28_4_ = 0x1fc01fc0;
    auVar164 = vpandq_avx512vl(auVar157,auVar25);
    auVar147 = vpternlogq_avx512vl(auVar146,auVar142,auVar147,0xfe);
    auVar157 = vpand_avx2(auVar145,local_4a0);
    auVar146 = vpand_avx2(auVar115,auVar182);
    auVar157 = vpsrlw_avx2(auVar157,4);
    auVar26._8_4_ = 0xfe00fe0;
    auVar26._0_8_ = 0xfe00fe00fe00fe0;
    auVar26._12_4_ = 0xfe00fe0;
    auVar26._16_4_ = 0xfe00fe0;
    auVar26._20_4_ = 0xfe00fe0;
    auVar26._24_4_ = 0xfe00fe0;
    auVar26._28_4_ = 0xfe00fe0;
    auVar142 = vpandq_avx512vl(auVar157,auVar26);
    auVar186 = vpsrlw_avx2(auVar146,8);
    auVar157 = vpand_avx2(auVar182,local_640);
    auVar154 = vpternlogq_avx512vl(auVar164,auVar142,auVar154,0xfe);
    auVar146 = vpand_avx2(auVar145,local_640);
    auVar157 = vpsrlw_avx2(auVar157,4);
    auVar105._8_8_ = uStack_458;
    auVar105._0_8_ = local_460;
    auVar105._16_8_ = uStack_450;
    auVar105._24_8_ = uStack_448;
    auVar27._8_4_ = 0xfc00fc0;
    auVar27._0_8_ = 0xfc00fc00fc00fc0;
    auVar27._12_4_ = 0xfc00fc0;
    auVar27._16_4_ = 0xfc00fc0;
    auVar27._20_4_ = 0xfc00fc0;
    auVar27._24_4_ = 0xfc00fc0;
    auVar27._28_4_ = 0xfc00fc0;
    auVar142 = vpandq_avx512vl(auVar157,auVar27);
    auVar157 = vpsrlw_avx2(auVar146,5);
    auVar28._8_4_ = 0x7e007e0;
    auVar28._0_8_ = 0x7e007e007e007e0;
    auVar28._12_4_ = 0x7e007e0;
    auVar28._16_4_ = 0x7e007e0;
    auVar28._20_4_ = 0x7e007e0;
    auVar28._24_4_ = 0x7e007e0;
    auVar28._28_4_ = 0x7e007e0;
    auVar146 = vpandq_avx512vl(auVar157,auVar28);
    auVar157 = vpand_avx2(auVar182,auVar105);
    auVar164 = vmovdqa64_avx512vl(auVar105);
    auVar148 = vpternlogq_avx512vl(auVar142,auVar146,auVar148,0xfe);
    auVar146 = vpand_avx2(auVar145,auVar105);
    auVar157 = vpsrlw_avx2(auVar157,5);
    auVar29._8_4_ = 0x7c007c0;
    auVar29._0_8_ = 0x7c007c007c007c0;
    auVar29._12_4_ = 0x7c007c0;
    auVar29._16_4_ = 0x7c007c0;
    auVar29._20_4_ = 0x7c007c0;
    auVar29._24_4_ = 0x7c007c0;
    auVar29._28_4_ = 0x7c007c0;
    auVar142 = vpandq_avx512vl(auVar157,auVar29);
    auVar157 = vpand_avx2(auVar161,auVar182);
    auVar146 = vpsrlw_avx2(auVar146,6);
    auVar30._8_4_ = 0x3e003e0;
    auVar30._0_8_ = 0x3e003e003e003e0;
    auVar30._12_4_ = 0x3e003e0;
    auVar30._16_4_ = 0x3e003e0;
    auVar30._20_4_ = 0x3e003e0;
    auVar30._24_4_ = 0x3e003e0;
    auVar30._28_4_ = 0x3e003e0;
    auVar146 = vpandq_avx512vl(auVar146,auVar30);
    auVar157 = vpsrlw_avx2(auVar157,6);
    auVar31._8_4_ = 0x3c003c0;
    auVar31._0_8_ = 0x3c003c003c003c0;
    auVar31._12_4_ = 0x3c003c0;
    auVar31._16_4_ = 0x3c003c0;
    auVar31._20_4_ = 0x3c003c0;
    auVar31._24_4_ = 0x3c003c0;
    auVar31._28_4_ = 0x3c003c0;
    auVar165 = vpandq_avx512vl(auVar157,auVar31);
    auVar157 = vpandq_avx512vl(auVar182,auVar135);
    auVar184 = vpsrlw_avx2(auVar157,7);
    auVar149 = vpternlogq_avx512vl(auVar142,auVar146,auVar149,0xfe);
    auVar157 = vpand_avx2(auVar145,auVar161);
    auVar161 = vmovdqa64_avx512vl(auVar135);
    auVar157 = vpsrlw_avx2(auVar157,7);
    auVar32._8_4_ = 0x1e001e0;
    auVar32._0_8_ = 0x1e001e001e001e0;
    auVar32._12_4_ = 0x1e001e0;
    auVar32._16_4_ = 0x1e001e0;
    auVar32._20_4_ = 0x1e001e0;
    auVar32._24_4_ = 0x1e001e0;
    auVar32._28_4_ = 0x1e001e0;
    auVar157 = vpandq_avx512vl(auVar157,auVar32);
    auVar156 = vpternlogq_avx512vl(auVar165,auVar157,auVar156,0xfe);
    auVar142 = vpandq_avx512vl(auVar145,auVar135);
    auVar33._8_4_ = 0x1c001c0;
    auVar33._0_8_ = 0x1c001c001c001c0;
    auVar33._12_4_ = 0x1c001c0;
    auVar33._16_4_ = 0x1c001c0;
    auVar33._20_4_ = 0x1c001c0;
    auVar33._24_4_ = 0x1c001c0;
    auVar33._28_4_ = 0x1c001c0;
    auVar165 = vpandq_avx512vl(auVar184,auVar33);
    auVar157 = vpand_avx2(auVar145,auVar112);
    auVar34._8_4_ = 0xc000c0;
    auVar34._0_8_ = 0xc000c000c000c0;
    auVar34._12_4_ = 0xc000c0;
    auVar34._16_4_ = 0xc000c0;
    auVar34._20_4_ = 0xc000c0;
    auVar34._24_4_ = 0xc000c0;
    auVar34._28_4_ = 0xc000c0;
    auVar135 = vpandq_avx512vl(auVar186,auVar34);
    auVar146 = vpand_avx2(auVar112,auVar182);
    auVar142 = vpsrlw_avx2(auVar142,8);
    auVar35._8_4_ = 0xe000e0;
    auVar35._0_8_ = 0xe000e000e000e0;
    auVar35._12_4_ = 0xe000e0;
    auVar35._16_4_ = 0xe000e0;
    auVar35._20_4_ = 0xe000e0;
    auVar35._24_4_ = 0xe000e0;
    auVar35._28_4_ = 0xe000e0;
    auVar142 = vpandq_avx512vl(auVar142,auVar35);
    auVar157 = vpsrlw_avx2(auVar157,10);
    auVar184 = vpsrlw_avx2(auVar146,9);
    auVar36._8_4_ = 0x200020;
    auVar36._0_8_ = 0x20002000200020;
    auVar36._12_4_ = 0x200020;
    auVar36._16_4_ = 0x200020;
    auVar36._20_4_ = 0x200020;
    auVar36._24_4_ = 0x200020;
    auVar36._28_4_ = 0x200020;
    auVar146 = vpandq_avx512vl(auVar157,auVar36);
    auVar37._8_4_ = 0x400040;
    auVar37._0_8_ = 0x40004000400040;
    auVar37._12_4_ = 0x400040;
    auVar37._16_4_ = 0x400040;
    auVar37._20_4_ = 0x400040;
    auVar37._24_4_ = 0x400040;
    auVar37._28_4_ = 0x400040;
    auVar184 = vpandq_avx512vl(auVar184,auVar37);
    auVar150 = vpternlogq_avx512vl(auVar165,auVar142,auVar150,0xfe);
    auVar157 = vpand_avx2(auVar145,auVar115);
    auVar145 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x70);
    auVar142 = vpbroadcastq_avx512vl(ZEXT816(0xffc0ffc0ffc0ffc0));
    auVar187 = vpternlogq_avx512vl(auVar184,auVar146,auVar187,0xfe);
    auVar157 = vpsrlw_avx2(auVar157,9);
    auVar38._8_4_ = 0x600060;
    auVar38._0_8_ = 0x60006000600060;
    auVar38._12_4_ = 0x600060;
    auVar38._16_4_ = 0x600060;
    auVar38._20_4_ = 0x600060;
    auVar38._24_4_ = 0x600060;
    auVar38._28_4_ = 0x600060;
    auVar157 = vpandq_avx512vl(auVar157,auVar38);
    auVar146 = vpandq_avx512vl(auVar160,auVar145);
    auVar151 = vpternlogq_avx512vl(auVar135,auVar157,auVar151,0xfe);
    auVar157 = vpandq_avx512vl(auVar182,auVar160);
    auVar146 = vpsllw_avx2(auVar146,7);
    auVar160 = vpbroadcastq_avx512vl(ZEXT816(0xff80ff80ff80ff80));
    auVar122._8_8_ = uStack_4d8;
    auVar122._0_8_ = local_4e0;
    auVar122._16_8_ = uStack_4d0;
    auVar122._24_8_ = uStack_4c8;
    auVar165 = vmovdqa64_avx512vl(auVar122);
    auVar157 = vpsllw_avx2(auVar157,6);
    auVar140 = vpternlogq_avx512vl(auVar146,auVar140,auVar157,0xfe);
    auVar157 = vpand_avx2(auVar182,local_5a0);
    auVar157 = vpsllw_avx2(auVar157,5);
    auVar146 = vpandq_avx512vl(auVar157,auVar142);
    auVar157 = vpand_avx2(auVar145,local_5a0);
    auVar157 = vpsllw_avx2(auVar157,6);
    auVar157 = vpandq_avx512vl(auVar157,auVar160);
    auVar139 = vpternlogq_avx512vl(auVar157,auVar146,auVar139,0xfe);
    auVar157 = vpand_avx2(auVar182,local_580);
    auVar157 = vpsllw_avx2(auVar157,4);
    auVar146 = vpandq_avx512vl(auVar157,auVar142);
    auVar157 = vpand_avx2(auVar145,local_580);
    auVar157 = vpsllw_avx2(auVar157,5);
    auVar157 = vpandq_avx512vl(auVar157,auVar160);
    auVar158 = vpternlogq_avx512vl(auVar157,auVar146,auVar158,0xfe);
    auVar157 = vpand_avx2(auVar182,local_560);
    auVar146 = vpand_avx2(auVar145,local_560);
    auVar157 = vpsllw_avx2(auVar157,3);
    auVar146 = vpsllw_avx2(auVar146,4);
    auVar157 = vpandq_avx512vl(auVar157,auVar142);
    auVar146 = vpandq_avx512vl(auVar146,auVar160);
    auVar159 = vpternlogq_avx512vl(auVar146,auVar157,auVar159,0xfe);
    auVar157 = vpand_avx2(local_540,auVar182);
    auVar157 = vpsllw_avx2(auVar157,2);
    auVar146 = vpandq_avx512vl(auVar157,auVar142);
    auVar182 = vpand_avx2(auVar182,local_520);
    auVar157 = vpand_avx2(auVar145,local_520);
    auVar166._8_2_ = 0xff00;
    auVar166._0_8_ = 0xff00ff00ff00ff00;
    auVar166._10_2_ = 0xff00;
    auVar166._12_2_ = 0xff00;
    auVar166._14_2_ = 0xff00;
    auVar166._16_2_ = 0xff00;
    auVar166._18_2_ = 0xff00;
    auVar166._20_2_ = 0xff00;
    auVar166._22_2_ = 0xff00;
    auVar166._24_2_ = 0xff00;
    auVar166._26_2_ = 0xff00;
    auVar166._28_2_ = 0xff00;
    auVar166._30_2_ = 0xff00;
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar135 = vpsllw_avx2(auVar157,2);
    auVar157 = vpandq_avx512vl(auVar182,auVar142);
    auVar182 = vpand_avx2(local_540,auVar145);
    auVar142 = vpandq_avx512vl(auVar135,auVar160);
    auVar182 = vpsllw_avx2(auVar182,3);
    auVar155 = vpternlogq_avx512vl(auVar142,auVar157,auVar155,0xfe);
    auVar182 = vpandq_avx512vl(auVar182,auVar160);
    auVar152 = vpternlogq_avx512vl(auVar182,auVar146,auVar152,0xfe);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x80);
    auVar146 = vpandq_avx512vl(auVar182,auVar134);
    auVar157 = vpand_avx2(local_500,auVar145);
    auVar157 = vpaddw_avx2(auVar157,auVar157);
    auVar142 = vpandq_avx512vl(auVar157,auVar160);
    auVar157 = vpand_avx2(auVar182,local_500);
    auVar157 = vpsllw_avx2(auVar157,2);
    auVar157 = vpand_avx2(auVar157,auVar166);
    auVar141 = vpternlogq_avx512vl(auVar157,auVar142,auVar141,0xfe);
    auVar157 = vpandq_avx512vl(auVar182,auVar165);
    auVar160 = vmovdqa64_avx512vl(auVar160);
    auVar160 = vpternlogq_avx512vl(auVar160,auVar145,auVar165,0x80);
    auVar157 = vpaddw_avx2(auVar157,auVar157);
    auVar157 = vpandq_avx512vl(auVar157,auVar166);
    auVar160 = vpternlogq_avx512vl(auVar157,auVar160,auVar162,0xfe);
    auVar157 = vpandq_avx512vl(auVar163,auVar145);
    auVar162 = vmovdqa64_avx512vl(local_540);
    auVar157 = vpsrlw_avx2(auVar157,1);
    auVar39._8_4_ = 0x7f807f80;
    auVar39._0_8_ = 0x7f807f807f807f80;
    auVar39._12_4_ = 0x7f807f80;
    auVar39._16_4_ = 0x7f807f80;
    auVar39._20_4_ = 0x7f807f80;
    auVar39._24_4_ = 0x7f807f80;
    auVar39._28_4_ = 0x7f807f80;
    auVar157 = vpandq_avx512vl(auVar157,auVar39);
    auVar163 = vpternlogq_avx512vl(auVar146,auVar157,auVar147,0xfe);
    auVar157 = vpand_avx2(auVar145,local_4a0);
    auVar146 = vpand_avx2(auVar182,local_4a0);
    auVar147 = vpsrlw_avx2(auVar157,2);
    auVar157 = vpsrlw_avx2(auVar146,1);
    auVar40._8_4_ = 0x7f007f00;
    auVar40._0_8_ = 0x7f007f007f007f00;
    auVar40._12_4_ = 0x7f007f00;
    auVar40._16_4_ = 0x7f007f00;
    auVar40._20_4_ = 0x7f007f00;
    auVar40._24_4_ = 0x7f007f00;
    auVar40._28_4_ = 0x7f007f00;
    auVar157 = vpandq_avx512vl(auVar157,auVar40);
    auVar41._8_4_ = 0x3f803f80;
    auVar41._0_8_ = 0x3f803f803f803f80;
    auVar41._12_4_ = 0x3f803f80;
    auVar41._16_4_ = 0x3f803f80;
    auVar41._20_4_ = 0x3f803f80;
    auVar41._24_4_ = 0x3f803f80;
    auVar41._28_4_ = 0x3f803f80;
    auVar146 = vpandq_avx512vl(auVar147,auVar41);
    auVar154 = vpternlogq_avx512vl(auVar157,auVar146,auVar154,0xfe);
    auVar157 = vpand_avx2(auVar145,local_640);
    auVar146 = vpand_avx2(auVar182,local_640);
    auVar147 = vpsrlw_avx2(auVar157,3);
    auVar157 = vpsrlw_avx2(auVar146,2);
    auVar42._8_4_ = 0x3f003f00;
    auVar42._0_8_ = 0x3f003f003f003f00;
    auVar42._12_4_ = 0x3f003f00;
    auVar42._16_4_ = 0x3f003f00;
    auVar42._20_4_ = 0x3f003f00;
    auVar42._24_4_ = 0x3f003f00;
    auVar42._28_4_ = 0x3f003f00;
    auVar157 = vpandq_avx512vl(auVar157,auVar42);
    auVar43._8_4_ = 0x1f801f80;
    auVar43._0_8_ = 0x1f801f801f801f80;
    auVar43._12_4_ = 0x1f801f80;
    auVar43._16_4_ = 0x1f801f80;
    auVar43._20_4_ = 0x1f801f80;
    auVar43._24_4_ = 0x1f801f80;
    auVar43._28_4_ = 0x1f801f80;
    auVar146 = vpandq_avx512vl(auVar147,auVar43);
    auVar147 = vpandq_avx512vl(auVar182,auVar164);
    auVar147 = vpsrlw_avx2(auVar147,3);
    auVar148 = vpternlogq_avx512vl(auVar157,auVar146,auVar148,0xfe);
    auVar157 = vpandq_avx512vl(auVar164,auVar145);
    auVar44._8_4_ = 0x1f001f00;
    auVar44._0_8_ = 0x1f001f001f001f00;
    auVar44._12_4_ = 0x1f001f00;
    auVar44._16_4_ = 0x1f001f00;
    auVar44._20_4_ = 0x1f001f00;
    auVar44._24_4_ = 0x1f001f00;
    auVar44._28_4_ = 0x1f001f00;
    auVar146 = vpandq_avx512vl(auVar147,auVar44);
    auVar101._8_8_ = uStack_438;
    auVar101._0_8_ = local_440;
    auVar101._16_8_ = uStack_430;
    auVar101._24_8_ = uStack_428;
    auVar157 = vpsrlw_avx2(auVar157,4);
    auVar45._8_4_ = 0xf800f80;
    auVar45._0_8_ = 0xf800f800f800f80;
    auVar45._12_4_ = 0xf800f80;
    auVar45._16_4_ = 0xf800f80;
    auVar45._20_4_ = 0xf800f80;
    auVar45._24_4_ = 0xf800f80;
    auVar45._28_4_ = 0xf800f80;
    auVar157 = vpandq_avx512vl(auVar157,auVar45);
    auVar149 = vpternlogq_avx512vl(auVar146,auVar157,auVar149,0xfe);
    auVar157 = vpand_avx2(auVar145,auVar101);
    auVar146 = vpand_avx2(auVar182,auVar101);
    auVar157 = vpsrlw_avx2(auVar157,5);
    auVar146 = vpsrlw_avx2(auVar146,4);
    auVar46._8_4_ = 0xf000f00;
    auVar46._0_8_ = 0xf000f000f000f00;
    auVar46._12_4_ = 0xf000f00;
    auVar46._16_4_ = 0xf000f00;
    auVar46._20_4_ = 0xf000f00;
    auVar46._24_4_ = 0xf000f00;
    auVar46._28_4_ = 0xf000f00;
    auVar146 = vpandq_avx512vl(auVar146,auVar46);
    auVar47._8_4_ = 0x7800780;
    auVar47._0_8_ = 0x780078007800780;
    auVar47._12_4_ = 0x7800780;
    auVar47._16_4_ = 0x7800780;
    auVar47._20_4_ = 0x7800780;
    auVar47._24_4_ = 0x7800780;
    auVar47._28_4_ = 0x7800780;
    auVar147 = vpandq_avx512vl(auVar157,auVar47);
    auVar157 = vpand_avx2(auVar182,auVar161);
    auVar157 = vpsrlw_avx2(auVar157,5);
    auVar48._8_4_ = 0x7000700;
    auVar48._0_8_ = 0x700070007000700;
    auVar48._12_4_ = 0x7000700;
    auVar48._16_4_ = 0x7000700;
    auVar48._20_4_ = 0x7000700;
    auVar48._24_4_ = 0x7000700;
    auVar48._28_4_ = 0x7000700;
    auVar142 = vpandq_avx512vl(auVar157,auVar48);
    auVar157 = vpand_avx2(auVar112,auVar145);
    auVar157 = vpsrlw_avx2(auVar157,8);
    auVar49._8_4_ = 0x800080;
    auVar49._0_8_ = 0x80008000800080;
    auVar49._12_4_ = 0x800080;
    auVar49._16_4_ = 0x800080;
    auVar49._20_4_ = 0x800080;
    auVar49._24_4_ = 0x800080;
    auVar49._28_4_ = 0x800080;
    auVar164 = vpandq_avx512vl(auVar157,auVar49);
    auVar156 = vpternlogq_avx512vl(auVar146,auVar147,auVar156,0xfe);
    auVar157 = vpand_avx2(auVar161,auVar145);
    auVar116._8_8_ = uStack_3f8;
    auVar116._0_8_ = local_400;
    auVar116._16_8_ = uStack_3f0;
    auVar116._24_8_ = uStack_3e8;
    auVar157 = vpsrlw_avx2(auVar157,6);
    auVar50._8_4_ = 0x3800380;
    auVar50._0_8_ = 0x380038003800380;
    auVar50._12_4_ = 0x3800380;
    auVar50._16_4_ = 0x3800380;
    auVar50._20_4_ = 0x3800380;
    auVar50._24_4_ = 0x3800380;
    auVar50._28_4_ = 0x3800380;
    auVar146 = vpandq_avx512vl(auVar157,auVar50);
    auVar157 = vpand_avx2(auVar182,auVar116);
    auVar150 = vpternlogq_avx512vl(auVar142,auVar146,auVar150,0xfe);
    auVar145 = vpand_avx2(auVar116,auVar145);
    auVar157 = vpsrlw_avx2(auVar157,6);
    auVar51._8_4_ = 0x3000300;
    auVar51._0_8_ = 0x300030003000300;
    auVar51._12_4_ = 0x3000300;
    auVar51._16_4_ = 0x3000300;
    auVar51._20_4_ = 0x3000300;
    auVar51._24_4_ = 0x3000300;
    auVar51._28_4_ = 0x3000300;
    auVar146 = vpandq_avx512vl(auVar157,auVar51);
    auVar157 = vpand_avx2(auVar182,auVar112);
    auVar109._8_8_ = uStack_5b8;
    auVar109._0_8_ = local_5c0;
    auVar109._16_8_ = uStack_5b0;
    auVar109._24_8_ = uStack_5a8;
    auVar161 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(data + lVar123 * 0x10 + 0x90));
    auVar145 = vpsrlw_avx2(auVar145,7);
    auVar52._8_4_ = 0x1800180;
    auVar52._0_8_ = 0x180018001800180;
    auVar52._12_4_ = 0x1800180;
    auVar52._16_4_ = 0x1800180;
    auVar52._20_4_ = 0x1800180;
    auVar52._24_4_ = 0x1800180;
    auVar52._28_4_ = 0x1800180;
    auVar145 = vpandq_avx512vl(auVar145,auVar52);
    auVar157 = vpsrlw_avx2(auVar157,7);
    auVar53._8_4_ = 0x1000100;
    auVar53._0_8_ = 0x100010001000100;
    auVar53._12_4_ = 0x1000100;
    auVar53._16_4_ = 0x1000100;
    auVar53._20_4_ = 0x1000100;
    auVar53._24_4_ = 0x1000100;
    auVar53._28_4_ = 0x1000100;
    auVar157 = vpandq_avx512vl(auVar157,auVar53);
    auVar151 = vpternlogq_avx512vl(auVar146,auVar145,auVar151,0xfe);
    auVar145 = vpand_avx2(auVar182,auVar109);
    auVar187 = vpternlogq_avx512vl(auVar157,auVar164,auVar187,0xfe);
    auVar157 = vpandq_avx512vl(auVar161,auVar109);
    auVar142 = vmovdqa64_avx512vl(local_580);
    auVar164 = vmovdqa64_avx512vl(local_560);
    auVar157 = vpsllw_avx512vl(auVar157,9);
    auVar145 = vpsllw_avx2(auVar145,8);
    auVar146 = vpandq_avx512vl(auVar161,local_5a0);
    auVar140 = vpternlogq_avx512vl(auVar157,auVar140,auVar145,0xfe);
    auVar185._8_8_ = 0xfe00fe00fe00fe00;
    auVar185._0_8_ = 0xfe00fe00fe00fe00;
    auVar185._16_8_ = 0xfe00fe00fe00fe00;
    auVar185._24_8_ = 0xfe00fe00fe00fe00;
    auVar145 = vpand_avx2(auVar182,local_5a0);
    auVar157 = vpsllw_avx2(auVar146,8);
    auVar145 = vpsllw_avx2(auVar145,7);
    auVar145 = vpand_avx2(auVar145,auVar166);
    auVar157 = vpand_avx2(auVar185,auVar157);
    auVar139 = vpternlogq_avx512vl(auVar157,auVar145,auVar139,0xfe);
    auVar145 = vpandq_avx512vl(auVar182,auVar142);
    auVar157 = vpandq_avx512vl(auVar161,auVar142);
    auVar145 = vpsllw_avx2(auVar145,6);
    auVar157 = vpsllw_avx2(auVar157,7);
    auVar145 = vpand_avx2(auVar145,auVar166);
    auVar157 = vpand_avx2(auVar185,auVar157);
    auVar158 = vpternlogq_avx512vl(auVar157,auVar145,auVar158,0xfe);
    auVar145 = vpandq_avx512vl(auVar182,auVar164);
    auVar157 = vpandq_avx512vl(auVar161,auVar164);
    auVar146 = vpsllw_avx2(auVar145,5);
    auVar145 = vpsllw_avx2(auVar157,6);
    auVar145 = vpand_avx2(auVar185,auVar145);
    auVar157 = vpand_avx2(auVar146,auVar166);
    auVar146 = vpand_avx2(auVar182,local_520);
    auVar159 = vpternlogq_avx512vl(auVar145,auVar157,auVar159,0xfe);
    auVar182 = vpandq_avx512vl(auVar182,auVar162);
    auVar145 = vpandq_avx512vl(auVar161,auVar162);
    auVar146 = vpsllw_avx2(auVar146,3);
    auVar157 = vpsllw_avx2(auVar182,4);
    auVar147 = vpsllw_avx2(auVar145,5);
    auVar182 = vpand_avx2(auVar146,auVar166);
    auVar145 = vpand_avx2(auVar157,auVar166);
    auVar157 = vpand_avx2(auVar185,auVar147);
    auVar167._8_8_ = 0xfc00fc00fc00fc00;
    auVar167._0_8_ = 0xfc00fc00fc00fc00;
    auVar167._16_8_ = 0xfc00fc00fc00fc00;
    auVar167._24_8_ = 0xfc00fc00fc00fc00;
    auVar152 = vpternlogq_avx512vl(auVar157,auVar145,auVar152,0xfe);
    auVar145 = vpandq_avx512vl(auVar161,local_520);
    auVar106._8_8_ = uStack_458;
    auVar106._0_8_ = local_460;
    auVar106._16_8_ = uStack_450;
    auVar106._24_8_ = uStack_448;
    auVar145 = vpsllw_avx2(auVar145,4);
    auVar145 = vpandq_avx512vl(auVar145,auVar185);
    auVar157 = vpandq_avx512vl(auVar161,local_500);
    auVar157 = vpsllw_avx2(auVar157,3);
    auVar155 = vpternlogq_avx512vl(auVar145,auVar182,auVar155,0xfe);
    auVar145 = vpand_avx2(auVar185,auVar157);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xa0);
    auVar157 = vpand_avx2(local_500,auVar182);
    auVar102._8_8_ = uStack_438;
    auVar102._0_8_ = local_440;
    auVar102._16_8_ = uStack_430;
    auVar102._24_8_ = uStack_428;
    auVar157 = vpsllw_avx2(auVar157,4);
    auVar157 = vpand_avx2(auVar157,auVar167);
    auVar141 = vpternlogq_avx512vl(auVar157,auVar145,auVar141,0xfe);
    auVar145 = vpandq_avx512vl(auVar161,auVar165);
    auVar157 = vpand_avx2(auVar182,local_200);
    auVar145 = vpsllw_avx2(auVar145,2);
    auVar145 = vpand_avx2(auVar185,auVar145);
    auVar146 = vpandq_avx512vl(auVar182,auVar165);
    auVar146 = vpsllw_avx2(auVar146,3);
    auVar146 = vpand_avx2(auVar146,auVar167);
    auVar160 = vpternlogq_avx512vl(auVar146,auVar145,auVar160,0xfe);
    auVar145 = vpandq_avx512vl(auVar161,local_4c0);
    auVar146 = vpand_avx2(auVar182,local_4c0);
    auVar145 = vpaddw_avx2(auVar145,auVar145);
    auVar147 = vpsllw_avx2(auVar146,2);
    auVar145 = vpand_avx2(auVar185,auVar145);
    auVar146 = vpand_avx2(auVar182,local_4a0);
    auVar147 = vpand_avx2(auVar147,auVar167);
    auVar163 = vpternlogq_avx512vl(auVar147,auVar145,auVar163,0xfe);
    auVar147 = vpandq_avx512vl(auVar161,auVar132);
    auVar145 = vpandq_avx512vl(auVar182,auVar102);
    auVar145 = vpsrlw_avx512vl(auVar145,2);
    auVar54._8_4_ = 0x3c003c00;
    auVar54._0_8_ = 0x3c003c003c003c00;
    auVar54._12_4_ = 0x3c003c00;
    auVar54._16_4_ = 0x3c003c00;
    auVar54._20_4_ = 0x3c003c00;
    auVar54._24_4_ = 0x3c003c00;
    auVar54._28_4_ = 0x3c003c00;
    auVar165 = vpandq_avx512vl(auVar145,auVar54);
    auVar145 = vpaddw_avx2(auVar146,auVar146);
    auVar145 = vpand_avx2(auVar145,auVar167);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar147,auVar154,0xfe);
    auVar145 = vpandq_avx512vl(auVar161,local_640);
    auVar110._8_8_ = uStack_5b8;
    auVar110._0_8_ = local_5c0;
    auVar110._16_8_ = uStack_5b0;
    auVar110._24_8_ = uStack_5a8;
    auVar145 = vpsrlw_avx2(auVar145,1);
    auVar55._8_4_ = 0x7e007e00;
    auVar55._0_8_ = 0x7e007e007e007e00;
    auVar55._12_4_ = 0x7e007e00;
    auVar55._16_4_ = 0x7e007e00;
    auVar55._20_4_ = 0x7e007e00;
    auVar55._24_4_ = 0x7e007e00;
    auVar55._28_4_ = 0x7e007e00;
    auVar145 = vpandq_avx512vl(auVar145,auVar55);
    auVar135 = vpternlogq_avx512vl(auVar157,auVar145,auVar148,0xfe);
    auVar157 = vpandq_avx512vl(auVar161,auVar106);
    auVar145 = vpand_avx2(auVar106,auVar182);
    auVar157 = vpsrlw_avx2(auVar157,2);
    auVar146 = vpsrlw_avx2(auVar145,1);
    auVar56._8_4_ = 0x3e003e00;
    auVar56._0_8_ = 0x3e003e003e003e00;
    auVar56._12_4_ = 0x3e003e00;
    auVar56._16_4_ = 0x3e003e00;
    auVar56._20_4_ = 0x3e003e00;
    auVar56._24_4_ = 0x3e003e00;
    auVar56._28_4_ = 0x3e003e00;
    auVar145 = vpandq_avx512vl(auVar157,auVar56);
    auVar57._8_4_ = 0x7c007c00;
    auVar57._0_8_ = 0x7c007c007c007c00;
    auVar57._12_4_ = 0x7c007c00;
    auVar57._16_4_ = 0x7c007c00;
    auVar57._20_4_ = 0x7c007c00;
    auVar57._24_4_ = 0x7c007c00;
    auVar57._28_4_ = 0x7c007c00;
    auVar157 = vpandq_avx512vl(auVar146,auVar57);
    auVar184 = vpternlogq_avx512vl(auVar157,auVar145,auVar149,0xfe);
    auVar145 = vpandq_avx512vl(auVar161,auVar102);
    auVar119._8_8_ = uStack_418;
    auVar119._0_8_ = local_420;
    auVar119._16_8_ = uStack_410;
    auVar119._24_8_ = uStack_408;
    auVar145 = vpsrlw_avx2(auVar145,3);
    auVar58._8_4_ = 0x1e001e00;
    auVar58._0_8_ = 0x1e001e001e001e00;
    auVar58._12_4_ = 0x1e001e00;
    auVar58._16_4_ = 0x1e001e00;
    auVar58._20_4_ = 0x1e001e00;
    auVar58._24_4_ = 0x1e001e00;
    auVar58._28_4_ = 0x1e001e00;
    auVar145 = vpandq_avx512vl(auVar145,auVar58);
    auVar188._8_8_ = 0xf800f800f800f800;
    auVar188._0_8_ = 0xf800f800f800f800;
    auVar188._16_8_ = 0xf800f800f800f800;
    auVar188._24_8_ = 0xf800f800f800f800;
    auVar145 = vpternlogq_avx512vl(auVar165,auVar145,auVar156,0xfe);
    auVar157 = vpandq_avx512vl(auVar161,auVar119);
    auVar146 = vpandq_avx512vl(auVar182,auVar119);
    auVar113._8_8_ = uStack_3d8;
    auVar113._0_8_ = local_3e0;
    auVar113._16_8_ = uStack_3d0;
    auVar113._24_8_ = uStack_3c8;
    auVar147 = vpsrlw_avx2(auVar157,4);
    auVar157 = vpsrlw_avx512vl(auVar146,3);
    auVar59._8_4_ = 0xe000e00;
    auVar59._0_8_ = 0xe000e000e000e00;
    auVar59._12_4_ = 0xe000e00;
    auVar59._16_4_ = 0xe000e00;
    auVar59._20_4_ = 0xe000e00;
    auVar59._24_4_ = 0xe000e00;
    auVar59._28_4_ = 0xe000e00;
    auVar146 = vpandq_avx512vl(auVar147,auVar59);
    auVar60._8_4_ = 0x1c001c00;
    auVar60._0_8_ = 0x1c001c001c001c00;
    auVar60._12_4_ = 0x1c001c00;
    auVar60._16_4_ = 0x1c001c00;
    auVar60._20_4_ = 0x1c001c00;
    auVar60._24_4_ = 0x1c001c00;
    auVar60._28_4_ = 0x1c001c00;
    auVar157 = vpandq_avx512vl(auVar157,auVar60);
    auVar145 = vmovdqa64_avx512vl(auVar145);
    auVar147 = vpandq_avx512vl(auVar182,auVar113);
    auVar157 = vpternlogq_avx512vl(auVar157,auVar146,auVar150,0xfe);
    auVar146 = vpandq_avx512vl(auVar161,auVar116);
    auVar148 = vpandq_avx512vl(auVar182,auVar116);
    auVar147 = vpsrlw_avx512vl(auVar147,5);
    auVar61._8_4_ = 0x4000400;
    auVar61._0_8_ = 0x400040004000400;
    auVar61._12_4_ = 0x4000400;
    auVar61._16_4_ = 0x4000400;
    auVar61._20_4_ = 0x4000400;
    auVar61._24_4_ = 0x4000400;
    auVar61._28_4_ = 0x4000400;
    auVar147 = vpandq_avx512vl(auVar147,auVar61);
    auVar149 = vpsrlw_avx2(auVar146,5);
    auVar146 = vpsrlw_avx512vl(auVar148,4);
    auVar62._8_4_ = 0x6000600;
    auVar62._0_8_ = 0x600060006000600;
    auVar62._12_4_ = 0x6000600;
    auVar62._16_4_ = 0x6000600;
    auVar62._20_4_ = 0x6000600;
    auVar62._24_4_ = 0x6000600;
    auVar62._28_4_ = 0x6000600;
    auVar148 = vpandq_avx512vl(auVar149,auVar62);
    auVar63._8_4_ = 0xc000c00;
    auVar63._0_8_ = 0xc000c000c000c00;
    auVar63._12_4_ = 0xc000c00;
    auVar63._16_4_ = 0xc000c00;
    auVar63._20_4_ = 0xc000c00;
    auVar63._24_4_ = 0xc000c00;
    auVar63._28_4_ = 0xc000c00;
    auVar146 = vpandq_avx512vl(auVar146,auVar63);
    auVar157 = vmovdqa64_avx512vl(auVar157);
    auVar146 = vpternlogq_avx512vl(auVar146,auVar148,auVar151,0xfe);
    auVar148 = vpandq_avx512vl(auVar161,auVar113);
    auVar148 = vpsrlw_avx2(auVar148,6);
    auVar64._8_4_ = 0x2000200;
    auVar64._0_8_ = 0x200020002000200;
    auVar64._12_4_ = 0x2000200;
    auVar64._16_4_ = 0x2000200;
    auVar64._20_4_ = 0x2000200;
    auVar64._24_4_ = 0x2000200;
    auVar64._28_4_ = 0x2000200;
    auVar148 = vpandq_avx512vl(auVar148,auVar64);
    auVar146 = vmovdqa64_avx512vl(auVar146);
    auVar147 = vpternlogq_avx512vl(auVar147,auVar148,auVar187,0xfe);
    auVar148 = vpand_avx2(auVar110,auVar182);
    auVar147 = vmovdqa64_avx512vl(auVar147);
    auVar150 = vpsllw_avx2(auVar148,10);
    auVar148 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xb0);
    auVar149 = vpand_avx2(auVar110,auVar148);
    auVar156 = vpand_avx2(local_5a0,auVar148);
    auVar149 = vpsllw_avx2(auVar149,0xb);
    auVar156 = vpsllw_avx2(auVar156,10);
    auVar150 = vpternlogq_avx512vl(auVar149,auVar140,auVar150,0xfe);
    auVar149 = vpand_avx2(local_5a0,auVar182);
    auVar156 = vpand_avx2(auVar156,auVar188);
    auVar149 = vpsllw_avx2(auVar149,9);
    auVar149 = vpand_avx2(auVar149,auVar167);
    auVar151 = vpternlogq_avx512vl(auVar156,auVar149,auVar139,0xfe);
    auVar149 = vpandq_avx512vl(auVar182,auVar142);
    auVar156 = vpandq_avx512vl(auVar148,auVar142);
    auVar149 = vpsllw_avx2(auVar149,8);
    auVar156 = vpsllw_avx2(auVar156,9);
    auVar149 = vpand_avx2(auVar149,auVar167);
    auVar156 = vpand_avx2(auVar156,auVar188);
    auVar139 = vpternlogq_avx512vl(auVar156,auVar149,auVar158,0xfe);
    auVar149 = vpandq_avx512vl(auVar182,auVar164);
    auVar156 = vpandq_avx512vl(auVar148,auVar164);
    auVar149 = vpsllw_avx2(auVar149,7);
    auVar156 = vpsllw_avx2(auVar156,8);
    auVar149 = vpand_avx2(auVar149,auVar167);
    auVar156 = vpand_avx2(auVar188,auVar156);
    auVar140 = vpternlogq_avx512vl(auVar156,auVar149,auVar159,0xfe);
    auVar149 = vpandq_avx512vl(auVar182,auVar162);
    auVar156 = vpandq_avx512vl(auVar148,auVar162);
    auVar182 = vpand_avx2(auVar182,local_520);
    auVar149 = vpsllw_avx2(auVar149,6);
    auVar156 = vpsllw_avx2(auVar156,7);
    auVar149 = vpand_avx2(auVar149,auVar167);
    auVar156 = vpand_avx2(auVar188,auVar156);
    auVar156 = vpternlogq_avx512vl(auVar156,auVar149,auVar152,0xfe);
    auVar149 = vpand_avx2(auVar148,local_520);
    auVar182 = vpsllw_avx2(auVar182,5);
    auVar182 = vpand_avx2(auVar182,auVar167);
    auVar168._8_8_ = 0x7800780078007800;
    auVar168._0_8_ = 0x7800780078007800;
    auVar168._16_8_ = 0x7800780078007800;
    auVar168._24_8_ = 0x7800780078007800;
    auVar149 = vpsllw_avx2(auVar149,6);
    auVar149 = vpand_avx2(auVar188,auVar149);
    auVar149 = vpternlogq_avx512vl(auVar149,auVar182,auVar155,0xfe);
    auVar182 = vpand_avx2(auVar148,local_500);
    auVar182 = vpsllw_avx2(auVar182,5);
    auVar152 = vpternlogq_avx512vl(auVar182,auVar141,auVar188,0xec);
    auVar69._8_8_ = uStack_4d8;
    auVar69._0_8_ = local_4e0;
    auVar69._16_8_ = uStack_4d0;
    auVar69._24_8_ = uStack_4c8;
    auVar182 = vpand_avx2(auVar148,auVar69);
    auVar182 = vpsllw_avx2(auVar182,4);
    auVar155 = vpternlogq_avx512vl(auVar182,auVar160,auVar188,0xec);
    auVar182 = vpand_avx2(auVar148,local_4c0);
    auVar182 = vpsllw_avx2(auVar182,3);
    auVar187 = vpternlogq_avx512vl(auVar182,auVar188,auVar163,0xea);
    auVar182 = vpand_avx2(auVar148,local_4a0);
    auVar182 = vpsllw_avx2(auVar182,2);
    auVar154 = vpternlogq_avx512vl(auVar182,auVar188,auVar154,0xea);
    auVar182 = vpand_avx2(auVar148,local_480);
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar158 = vpternlogq_avx512vl(auVar182,auVar188,auVar135,0xea);
    auVar74._8_8_ = uStack_458;
    auVar74._0_8_ = local_460;
    auVar74._16_8_ = uStack_450;
    auVar74._24_8_ = uStack_448;
    auVar182 = vpand_avx2(auVar148,auVar74);
    auVar141 = vpternlogq_avx512vl(auVar182,auVar188,auVar184,0xea);
    auVar79._8_8_ = uStack_438;
    auVar79._0_8_ = local_440;
    auVar79._16_8_ = uStack_430;
    auVar79._24_8_ = uStack_428;
    auVar182 = vpand_avx2(auVar148,auVar79);
    auVar182 = vpsrlw_avx2(auVar182,1);
    auVar148 = vpternlogq_avx512vl(auVar182,auVar168,auVar145,0xea);
    auVar169._8_8_ = 0x3800380038003800;
    auVar169._0_8_ = 0x3800380038003800;
    auVar169._16_8_ = 0x3800380038003800;
    auVar169._24_8_ = 0x3800380038003800;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xb0);
    auVar84._8_8_ = uStack_418;
    auVar84._0_8_ = local_420;
    auVar84._16_8_ = uStack_410;
    auVar84._24_8_ = uStack_408;
    auVar145 = vpand_avx2(auVar182,auVar84);
    auVar145 = vpsrlw_avx2(auVar145,2);
    auVar159 = vpternlogq_avx512vl(auVar145,auVar169,auVar157,0xea);
    auVar170._8_8_ = 0x1800180018001800;
    auVar170._0_8_ = 0x1800180018001800;
    auVar170._16_8_ = 0x1800180018001800;
    auVar170._24_8_ = 0x1800180018001800;
    auVar89._8_8_ = uStack_3f8;
    auVar89._0_8_ = local_400;
    auVar89._16_8_ = uStack_3f0;
    auVar89._24_8_ = uStack_3e8;
    auVar145 = vpand_avx2(auVar182,auVar89);
    auVar94._8_8_ = uStack_3d8;
    auVar94._0_8_ = local_3e0;
    auVar94._16_8_ = uStack_3d0;
    auVar94._24_8_ = uStack_3c8;
    auVar182 = vpand_avx2(auVar182,auVar94);
    auVar145 = vpsrlw_avx2(auVar145,3);
    auVar146 = vpternlogq_avx512vl(auVar145,auVar170,auVar146,0xea);
    auVar171._8_8_ = 0x800080008000800;
    auVar171._0_8_ = 0x800080008000800;
    auVar171._16_8_ = 0x800080008000800;
    auVar171._24_8_ = 0x800080008000800;
    auVar182 = vpsrlw_avx2(auVar182,4);
    auVar147 = vpternlogq_avx512vl(auVar182,auVar171,auVar147,0xea);
    auVar172._8_8_ = 0xf000f000f000f000;
    auVar172._0_8_ = 0xf000f000f000f000;
    auVar172._16_8_ = 0xf000f000f000f000;
    auVar172._24_8_ = 0xf000f000f000f000;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xc0);
    auVar65._8_8_ = uStack_5b8;
    auVar65._0_8_ = local_5c0;
    auVar65._16_8_ = uStack_5b0;
    auVar65._24_8_ = uStack_5a8;
    auVar145 = vpand_avx2(auVar182,auVar65);
    auVar145 = vpsllw_avx2(auVar145,0xc);
    auVar157 = vpor_avx2(auVar145,auVar150);
    auVar145 = vpand_avx2(auVar182,local_5a0);
    auVar145 = vpsllw_avx2(auVar145,0xb);
    auVar150 = vpternlogq_avx512vl(auVar145,auVar172,auVar151,0xea);
    auVar145 = vpand_avx2(auVar182,local_580);
    auVar145 = vpsllw_avx2(auVar145,10);
    auVar151 = vpternlogq_avx512vl(auVar145,auVar172,auVar139,0xea);
    auVar145 = vpand_avx2(auVar182,local_560);
    auVar145 = vpsllw_avx2(auVar145,9);
    auVar139 = vpternlogq_avx512vl(auVar145,auVar172,auVar140,0xea);
    auVar145 = vpand_avx2(auVar182,local_540);
    auVar145 = vpsllw_avx2(auVar145,8);
    auVar156 = vpternlogq_avx512vl(auVar145,auVar172,auVar156,0xea);
    auVar145 = vpand_avx2(auVar182,local_520);
    auVar145 = vpsllw_avx2(auVar145,7);
    auVar149 = vpternlogq_avx512vl(auVar145,auVar172,auVar149,0xea);
    auVar145 = vpand_avx2(auVar182,local_500);
    auVar145 = vpsllw_avx2(auVar145,6);
    auVar152 = vpternlogq_avx512vl(auVar145,auVar172,auVar152,0xea);
    auVar70._8_8_ = uStack_4d8;
    auVar70._0_8_ = local_4e0;
    auVar70._16_8_ = uStack_4d0;
    auVar70._24_8_ = uStack_4c8;
    auVar145 = vpand_avx2(auVar182,auVar70);
    auVar145 = vpsllw_avx2(auVar145,5);
    auVar155 = vpternlogq_avx512vl(auVar145,auVar172,auVar155,0xea);
    auVar145 = vpand_avx2(auVar182,local_4c0);
    auVar145 = vpsllw_avx2(auVar145,4);
    auVar140 = vpternlogq_avx512vl(auVar145,auVar172,auVar187,0xea);
    auVar145 = vpand_avx2(auVar182,local_4a0);
    auVar145 = vpsllw_avx2(auVar145,3);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar172,auVar154,0xea);
    auVar145 = vpand_avx2(auVar182,local_480);
    auVar75._8_8_ = uStack_458;
    auVar75._0_8_ = local_460;
    auVar75._16_8_ = uStack_450;
    auVar75._24_8_ = uStack_448;
    auVar182 = vpand_avx2(auVar182,auVar75);
    auVar145 = vpsllw_avx2(auVar145,2);
    auVar187 = vpternlogq_avx512vl(auVar145,auVar172,auVar158,0xea);
    auVar182 = vpaddw_avx2(auVar182,auVar182);
    auVar158 = vpternlogq_avx512vl(auVar182,auVar172,auVar141,0xea);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xc0);
    auVar80._8_8_ = uStack_438;
    auVar80._0_8_ = local_440;
    auVar80._16_8_ = uStack_430;
    auVar80._24_8_ = uStack_428;
    auVar145 = vpand_avx2(auVar182,auVar80);
    auVar148 = vpternlogq_avx512vl(auVar145,auVar172,auVar148,0xea);
    auVar173._8_8_ = 0x7000700070007000;
    auVar173._0_8_ = 0x7000700070007000;
    auVar173._16_8_ = 0x7000700070007000;
    auVar173._24_8_ = 0x7000700070007000;
    auVar85._8_8_ = uStack_418;
    auVar85._0_8_ = local_420;
    auVar85._16_8_ = uStack_410;
    auVar85._24_8_ = uStack_408;
    auVar145 = vpand_avx2(auVar182,auVar85);
    auVar145 = vpsrlw_avx2(auVar145,1);
    auVar141 = vpternlogq_avx512vl(auVar145,auVar173,auVar159,0xea);
    auVar174._8_8_ = 0x3000300030003000;
    auVar174._0_8_ = 0x3000300030003000;
    auVar174._16_8_ = 0x3000300030003000;
    auVar174._24_8_ = 0x3000300030003000;
    auVar90._8_8_ = uStack_3f8;
    auVar90._0_8_ = local_400;
    auVar90._16_8_ = uStack_3f0;
    auVar90._24_8_ = uStack_3e8;
    auVar145 = vpand_avx2(auVar182,auVar90);
    auVar95._8_8_ = uStack_3d8;
    auVar95._0_8_ = local_3e0;
    auVar95._16_8_ = uStack_3d0;
    auVar95._24_8_ = uStack_3c8;
    auVar182 = vpand_avx2(auVar182,auVar95);
    auVar145 = vpsrlw_avx2(auVar145,2);
    auVar146 = vpternlogq_avx512vl(auVar145,auVar174,auVar146,0xea);
    auVar175._8_8_ = 0x1000100010001000;
    auVar175._0_8_ = 0x1000100010001000;
    auVar175._16_8_ = 0x1000100010001000;
    auVar175._24_8_ = 0x1000100010001000;
    auVar182 = vpsrlw_avx2(auVar182,3);
    auVar147 = vpternlogq_avx512vl(auVar182,auVar175,auVar147,0xea);
    auVar176._8_8_ = 0xe000e000e000e000;
    auVar176._0_8_ = 0xe000e000e000e000;
    auVar176._16_8_ = 0xe000e000e000e000;
    auVar176._24_8_ = 0xe000e000e000e000;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xd0);
    auVar66._8_8_ = uStack_5b8;
    auVar66._0_8_ = local_5c0;
    auVar66._16_8_ = uStack_5b0;
    auVar66._24_8_ = uStack_5a8;
    auVar145 = vpand_avx2(auVar182,auVar66);
    auVar145 = vpsllw_avx2(auVar145,0xd);
    auVar157 = vpor_avx2(auVar145,auVar157);
    auVar145 = vpand_avx2(auVar182,local_5a0);
    auVar145 = vpsllw_avx2(auVar145,0xc);
    auVar150 = vpternlogq_avx512vl(auVar145,auVar176,auVar150,0xea);
    auVar145 = vpand_avx2(auVar182,local_580);
    auVar145 = vpsllw_avx2(auVar145,0xb);
    auVar151 = vpternlogq_avx512vl(auVar145,auVar176,auVar151,0xea);
    auVar145 = vpand_avx2(auVar182,local_560);
    auVar145 = vpsllw_avx2(auVar145,10);
    auVar139 = vpternlogq_avx512vl(auVar145,auVar176,auVar139,0xea);
    auVar145 = vpand_avx2(auVar182,local_540);
    auVar145 = vpsllw_avx2(auVar145,9);
    auVar156 = vpternlogq_avx512vl(auVar145,auVar176,auVar156,0xea);
    auVar145 = vpand_avx2(auVar182,local_520);
    auVar145 = vpsllw_avx2(auVar145,8);
    auVar149 = vpternlogq_avx512vl(auVar145,auVar176,auVar149,0xea);
    auVar145 = vpand_avx2(auVar182,local_500);
    auVar145 = vpsllw_avx2(auVar145,7);
    auVar152 = vpternlogq_avx512vl(auVar145,auVar176,auVar152,0xea);
    auVar71._8_8_ = uStack_4d8;
    auVar71._0_8_ = local_4e0;
    auVar71._16_8_ = uStack_4d0;
    auVar71._24_8_ = uStack_4c8;
    auVar145 = vpand_avx2(auVar182,auVar71);
    auVar145 = vpsllw_avx2(auVar145,6);
    auVar155 = vpternlogq_avx512vl(auVar145,auVar176,auVar155,0xea);
    auVar145 = vpand_avx2(auVar182,local_4c0);
    auVar145 = vpsllw_avx2(auVar145,5);
    auVar140 = vpternlogq_avx512vl(auVar145,auVar176,auVar140,0xea);
    auVar145 = vpand_avx2(auVar182,local_4a0);
    auVar145 = vpsllw_avx2(auVar145,4);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar176,auVar154,0xea);
    auVar145 = vpand_avx2(auVar182,local_480);
    auVar76._8_8_ = uStack_458;
    auVar76._0_8_ = local_460;
    auVar76._16_8_ = uStack_450;
    auVar76._24_8_ = uStack_448;
    auVar182 = vpand_avx2(auVar182,auVar76);
    auVar145 = vpsllw_avx2(auVar145,3);
    auVar187 = vpternlogq_avx512vl(auVar145,auVar176,auVar187,0xea);
    auVar182 = vpsllw_avx2(auVar182,2);
    auVar158 = vpternlogq_avx512vl(auVar182,auVar176,auVar158,0xea);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xd0);
    auVar81._8_8_ = uStack_438;
    auVar81._0_8_ = local_440;
    auVar81._16_8_ = uStack_430;
    auVar81._24_8_ = uStack_428;
    auVar145 = vpand_avx2(auVar182,auVar81);
    auVar145 = vpaddw_avx2(auVar145,auVar145);
    auVar148 = vpternlogq_avx512vl(auVar145,auVar176,auVar148,0xea);
    auVar86._8_8_ = uStack_418;
    auVar86._0_8_ = local_420;
    auVar86._16_8_ = uStack_410;
    auVar86._24_8_ = uStack_408;
    auVar145 = vpand_avx2(auVar182,auVar86);
    auVar141 = vpternlogq_avx512vl(auVar145,auVar176,auVar141,0xea);
    auVar177._8_8_ = 0x6000600060006000;
    auVar177._0_8_ = 0x6000600060006000;
    auVar177._16_8_ = 0x6000600060006000;
    auVar177._24_8_ = 0x6000600060006000;
    auVar91._8_8_ = uStack_3f8;
    auVar91._0_8_ = local_400;
    auVar91._16_8_ = uStack_3f0;
    auVar91._24_8_ = uStack_3e8;
    auVar145 = vpand_avx2(auVar182,auVar91);
    auVar96._8_8_ = uStack_3d8;
    auVar96._0_8_ = local_3e0;
    auVar96._16_8_ = uStack_3d0;
    auVar96._24_8_ = uStack_3c8;
    auVar182 = vpand_avx2(auVar182,auVar96);
    auVar145 = vpsrlw_avx2(auVar145,1);
    auVar146 = vpternlogq_avx512vl(auVar145,auVar177,auVar146,0xea);
    auVar178._8_8_ = 0x2000200020002000;
    auVar178._0_8_ = 0x2000200020002000;
    auVar178._16_8_ = 0x2000200020002000;
    auVar178._24_8_ = 0x2000200020002000;
    auVar182 = vpsrlw_avx2(auVar182,2);
    auVar147 = vpternlogq_avx512vl(auVar182,auVar178,auVar147,0xea);
    auVar179._8_8_ = 0xc000c000c000c000;
    auVar179._0_8_ = 0xc000c000c000c000;
    auVar179._16_8_ = 0xc000c000c000c000;
    auVar179._24_8_ = 0xc000c000c000c000;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xe0);
    auVar67._8_8_ = uStack_5b8;
    auVar67._0_8_ = local_5c0;
    auVar67._16_8_ = uStack_5b0;
    auVar67._24_8_ = uStack_5a8;
    auVar145 = vpand_avx2(auVar182,auVar67);
    auVar145 = vpsllw_avx2(auVar145,0xe);
    auVar157 = vpor_avx2(auVar145,auVar157);
    auVar145 = vpand_avx2(auVar182,local_5a0);
    auVar145 = vpsllw_avx2(auVar145,0xd);
    auVar150 = vpternlogq_avx512vl(auVar145,auVar179,auVar150,0xea);
    auVar145 = vpand_avx2(auVar182,local_580);
    auVar145 = vpsllw_avx2(auVar145,0xc);
    auVar151 = vpternlogq_avx512vl(auVar145,auVar179,auVar151,0xea);
    auVar145 = vpand_avx2(auVar182,local_560);
    auVar145 = vpsllw_avx2(auVar145,0xb);
    auVar139 = vpternlogq_avx512vl(auVar145,auVar179,auVar139,0xea);
    auVar145 = vpand_avx2(auVar182,local_540);
    auVar145 = vpsllw_avx2(auVar145,10);
    auVar156 = vpternlogq_avx512vl(auVar145,auVar179,auVar156,0xea);
    auVar145 = vpand_avx2(auVar182,local_520);
    auVar145 = vpsllw_avx2(auVar145,9);
    auVar149 = vpternlogq_avx512vl(auVar145,auVar179,auVar149,0xea);
    auVar145 = vpand_avx2(auVar182,local_500);
    auVar145 = vpsllw_avx2(auVar145,8);
    auVar152 = vpternlogq_avx512vl(auVar145,auVar179,auVar152,0xea);
    auVar72._8_8_ = uStack_4d8;
    auVar72._0_8_ = local_4e0;
    auVar72._16_8_ = uStack_4d0;
    auVar72._24_8_ = uStack_4c8;
    auVar145 = vpand_avx2(auVar182,auVar72);
    auVar145 = vpsllw_avx2(auVar145,7);
    auVar155 = vpternlogq_avx512vl(auVar145,auVar179,auVar155,0xea);
    auVar145 = vpand_avx2(auVar182,local_4c0);
    auVar145 = vpsllw_avx2(auVar145,6);
    auVar140 = vpternlogq_avx512vl(auVar145,auVar179,auVar140,0xea);
    auVar145 = vpand_avx2(auVar182,local_4a0);
    auVar145 = vpsllw_avx2(auVar145,5);
    auVar154 = vpternlogq_avx512vl(auVar145,auVar179,auVar154,0xea);
    auVar145 = vpand_avx2(auVar182,local_480);
    auVar77._8_8_ = uStack_458;
    auVar77._0_8_ = local_460;
    auVar77._16_8_ = uStack_450;
    auVar77._24_8_ = uStack_448;
    auVar182 = vpand_avx2(auVar182,auVar77);
    auVar145 = vpsllw_avx2(auVar145,4);
    auVar187 = vpternlogq_avx512vl(auVar145,auVar179,auVar187,0xea);
    auVar182 = vpsllw_avx2(auVar182,3);
    auVar158 = vpternlogq_avx512vl(auVar182,auVar179,auVar158,0xea);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xe0);
    auVar82._8_8_ = uStack_438;
    auVar82._0_8_ = local_440;
    auVar82._16_8_ = uStack_430;
    auVar82._24_8_ = uStack_428;
    auVar145 = vpand_avx2(auVar182,auVar82);
    auVar145 = vpsllw_avx2(auVar145,2);
    auVar148 = vpternlogq_avx512vl(auVar145,auVar179,auVar148,0xea);
    auVar87._8_8_ = uStack_418;
    auVar87._0_8_ = local_420;
    auVar87._16_8_ = uStack_410;
    auVar87._24_8_ = uStack_408;
    auVar145 = vpand_avx2(auVar182,auVar87);
    auVar145 = vpaddw_avx2(auVar145,auVar145);
    auVar141 = vpternlogq_avx512vl(auVar145,auVar179,auVar141,0xea);
    auVar92._8_8_ = uStack_3f8;
    auVar92._0_8_ = local_400;
    auVar92._16_8_ = uStack_3f0;
    auVar92._24_8_ = uStack_3e8;
    auVar145 = vpand_avx2(auVar182,auVar92);
    auVar97._8_8_ = uStack_3d8;
    auVar97._0_8_ = local_3e0;
    auVar97._16_8_ = uStack_3d0;
    auVar97._24_8_ = uStack_3c8;
    auVar182 = vpand_avx2(auVar182,auVar97);
    auVar146 = vpternlogq_avx512vl(auVar145,auVar179,auVar146,0xea);
    auVar180._8_8_ = 0x4000400040004000;
    auVar180._0_8_ = 0x4000400040004000;
    auVar180._16_8_ = 0x4000400040004000;
    auVar180._24_8_ = 0x4000400040004000;
    auVar182 = vpsrlw_avx2(auVar182,1);
    auVar147 = vpternlogq_avx512vl(auVar182,auVar180,auVar147,0xea);
    auVar181._8_8_ = 0x8000800080008000;
    auVar181._0_8_ = 0x8000800080008000;
    auVar181._16_8_ = 0x8000800080008000;
    auVar181._24_8_ = 0x8000800080008000;
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xf0);
    auVar68._8_8_ = uStack_5b8;
    auVar68._0_8_ = local_5c0;
    auVar68._16_8_ = uStack_5b0;
    auVar68._24_8_ = uStack_5a8;
    auVar145 = vpand_avx2(auVar182,auVar68);
    auVar145 = vpsllw_avx2(auVar145,0xf);
    local_840 = vpor_avx2(auVar145,auVar157);
    auVar145 = vpand_avx2(auVar182,local_5a0);
    auVar145 = vpsllw_avx2(auVar145,0xe);
    local_820 = vpternlogq_avx512vl(auVar145,auVar181,auVar150,0xea);
    auVar145 = vpand_avx2(auVar182,local_580);
    auVar145 = vpsllw_avx2(auVar145,0xd);
    local_800 = vpternlogq_avx512vl(auVar145,auVar181,auVar151,0xea);
    auVar145 = vpand_avx2(auVar182,local_560);
    auVar145 = vpsllw_avx2(auVar145,0xc);
    local_7e0 = vpternlogq_avx512vl(auVar145,auVar181,auVar139,0xea);
    auVar145 = vpand_avx2(auVar182,local_540);
    auVar145 = vpsllw_avx2(auVar145,0xb);
    local_7c0 = vpternlogq_avx512vl(auVar145,auVar181,auVar156,0xea);
    auVar145 = vpand_avx2(auVar182,local_520);
    auVar145 = vpsllw_avx2(auVar145,10);
    local_7a0 = vpternlogq_avx512vl(auVar145,auVar181,auVar149,0xea);
    auVar145 = vpand_avx2(auVar182,local_500);
    auVar145 = vpsllw_avx2(auVar145,9);
    local_780 = vpternlogq_avx512vl(auVar145,auVar181,auVar152,0xea);
    auVar73._8_8_ = uStack_4d8;
    auVar73._0_8_ = local_4e0;
    auVar73._16_8_ = uStack_4d0;
    auVar73._24_8_ = uStack_4c8;
    auVar145 = vpand_avx2(auVar182,auVar73);
    auVar145 = vpsllw_avx2(auVar145,8);
    local_760 = vpternlogq_avx512vl(auVar145,auVar181,auVar155,0xea);
    auVar145 = vpand_avx2(auVar182,local_4c0);
    auVar145 = vpsllw_avx2(auVar145,7);
    local_740 = vpternlogq_avx512vl(auVar145,auVar181,auVar140,0xea);
    auVar145 = vpand_avx2(auVar182,local_4a0);
    auVar145 = vpsllw_avx2(auVar145,6);
    local_720 = vpternlogq_avx512vl(auVar145,auVar181,auVar154,0xea);
    auVar145 = vpand_avx2(auVar182,local_480);
    auVar78._8_8_ = uStack_458;
    auVar78._0_8_ = local_460;
    auVar78._16_8_ = uStack_450;
    auVar78._24_8_ = uStack_448;
    auVar182 = vpand_avx2(auVar182,auVar78);
    auVar145 = vpsllw_avx2(auVar145,5);
    local_700 = vpternlogq_avx512vl(auVar145,auVar181,auVar187,0xea);
    auVar182 = vpsllw_avx2(auVar182,4);
    local_6e0 = vpternlogq_avx512vl(auVar182,auVar181,auVar158,0xea);
    auVar182 = *(undefined1 (*) [32])(data + lVar123 * 0x10 + 0xf0);
    lVar124 = 0;
    auVar83._8_8_ = uStack_438;
    auVar83._0_8_ = local_440;
    auVar83._16_8_ = uStack_430;
    auVar83._24_8_ = uStack_428;
    auVar145 = vpand_avx2(auVar182,auVar83);
    auVar145 = vpsllw_avx2(auVar145,3);
    local_6c0 = vpternlogq_avx512vl(auVar145,auVar181,auVar148,0xea);
    auVar88._8_8_ = uStack_418;
    auVar88._0_8_ = local_420;
    auVar88._16_8_ = uStack_410;
    auVar88._24_8_ = uStack_408;
    auVar145 = vpand_avx2(auVar182,auVar88);
    auVar145 = vpsllw_avx2(auVar145,2);
    local_6a0 = vpternlogq_avx512vl(auVar145,auVar181,auVar141,0xea);
    auVar93._8_8_ = uStack_3f8;
    auVar93._0_8_ = local_400;
    auVar93._16_8_ = uStack_3f0;
    auVar93._24_8_ = uStack_3e8;
    auVar145 = vpand_avx2(auVar182,auVar93);
    auVar98._8_8_ = uStack_3d8;
    auVar98._0_8_ = local_3e0;
    auVar98._16_8_ = uStack_3d0;
    auVar98._24_8_ = uStack_3c8;
    auVar157 = vpand_avx2(auVar182,auVar98);
    auVar182 = vpaddw_avx2(auVar145,auVar145);
    local_680 = vpternlogq_avx512vl(auVar182,auVar181,auVar146,0xea);
    local_660 = vpternlogq_avx512vl(auVar157,auVar181,auVar147,0xea);
    for (; lVar124 != 0x40; lVar124 = lVar124 + 4) {
      auVar182 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [32])(local_840 + lVar124 * 8));
      lVar1 = lVar124 * 8;
      *(undefined8 *)(local_840 + lVar1) = 0;
      *(undefined8 *)(local_840 + lVar1 + 8) = 0;
      *(undefined8 *)(local_840 + lVar1 + 0x10) = 0;
      *(undefined8 *)(local_820 + lVar1 + -8) = 0;
      auVar126 = vpmovqb_avx512vl(auVar182);
      auVar126 = vpsadbw_avx(ZEXT416(auVar126._0_4_),(undefined1  [16])0x0);
      *(int *)(local_240 + lVar124) = *(int *)(local_240 + lVar124) + auVar126._0_4_;
    }
    lVar123 = lVar123 + 0x10;
  }
  for (uVar125 = (ulong)(uint)((int)lVar123 << 4); uVar125 < len; uVar125 = uVar125 + 1) {
    uVar2 = data[uVar125];
    for (lVar123 = 0; lVar123 != 0x10; lVar123 = lVar123 + 1) {
      *(uint *)(local_240 + lVar123 * 4) =
           *(int *)(local_240 + lVar123 * 4) + (uint)((uVar2 >> ((uint)lVar123 & 0x1f) & 1) != 0);
    }
  }
  for (lVar123 = 0; lVar123 != 0x10; lVar123 = lVar123 + 1) {
    flags[lVar123] = *(uint32_t *)(local_240 + lVar123 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_popcnt(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i stubs[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm256_set1_epi16(1 << i);
        stubs[i] = _mm256_set1_epi16(0);
    }

    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_cycles_updates = n_cycles / 16;

#define UPDATE(idx, shift) stubs[idx] = _mm256_or_si256(stubs[idx], _mm256_slli_epi16(_mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx), shift));
#define ITERATION(idx) {                                           \
    UPDATE(0,idx);  UPDATE(1,idx);  UPDATE(2,idx);  UPDATE(3,idx); \
    UPDATE(4,idx);  UPDATE(5,idx);  UPDATE(6,idx);  UPDATE(7,idx); \
    UPDATE(8,idx);  UPDATE(9,idx);  UPDATE(10,idx); UPDATE(11,idx);\
    UPDATE(12,idx); UPDATE(13,idx); UPDATE(14,idx); UPDATE(15,idx);\
    ++pos;                                                         \
}
#define BLOCK {                                                \
    ITERATION(0);  ITERATION(1);  ITERATION(2);  ITERATION(3); \
    ITERATION(4);  ITERATION(5);  ITERATION(6);  ITERATION(7); \
    ITERATION(8);  ITERATION(9);  ITERATION(10); ITERATION(11);\
    ITERATION(12); ITERATION(13); ITERATION(14); ITERATION(15);\
}

    uint32_t pos = 0;
    for (size_t i = 0; i < n_cycles_updates; ++i) {
        BLOCK // unrolled
        
        // Not unrolled
        /*
        for (int c = 0; c < 16; ++c) { // 16 iterations per register
            ITERATION(c)
            // for (int j = 0; j < 16; ++j) { // each 1-hot per register
            //     UPDATE(j,c)
            // }
        }
        */

        for (int j = 0; j < 16; ++j) {
            PIL_POPCOUNT_AVX2(out_counters[j], stubs[j])
            stubs[j] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            out_counters[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    for (int i = 0; i < 16; ++i)
        flags[i] = out_counters[i];

#undef BLOCK
#undef ITERATION
#undef UPDATE

    return 0;
}